

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ram_test.cc
# Opt level: O2

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  RamUpdateUserRequestType *this;
  HttpTestListener *this_00;
  allocator<char> local_2b9;
  RamClearAccountAliasResponseType resp_6;
  string local_298 [32];
  string local_278;
  string local_258;
  RamActivateServiceResponseType resp;
  RamCreateAccessKeyRequestType req_6;
  _Alloc_hider local_1f8;
  _Alloc_hider local_1f0;
  undefined1 local_1e8 [16];
  char local_1d8 [8];
  _Alloc_hider local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  char local_1b8 [8];
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  _Alloc_hider local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  RamActivateServiceRequestType req;
  _Alloc_hider local_138;
  _Alloc_hider _Stack_130;
  undefined1 local_128 [16];
  char local_118 [8];
  _Alloc_hider local_110;
  undefined1 local_108 [16];
  char local_f8 [8];
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  paVar1 = &req.account_id.field_2;
  req.account_id._M_string_length = 0;
  req.account_id.field_2._M_allocated_capacity =
       req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
  req.account_id._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
  std::__cxx11::string::string<std::allocator<char>>
            (local_298,"my_appid",(allocator<char> *)&resp_6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"my_secret",&local_2b9);
  this = (RamUpdateUserRequestType *)aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string((string *)&req_6);
  if (this == (RamUpdateUserRequestType *)0x0) {
    std::__cxx11::string::~string((string *)&req);
    req.account_id._M_string_length = 0;
    req.account_id.field_2._M_allocated_capacity =
         req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
    _Stack_130._M_p = (pointer)0x0;
    local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
    req.account_id._M_dataplus._M_p = (pointer)paVar1;
    local_138._M_p = local_128;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
    std::__cxx11::string::string<std::allocator<char>>
              (local_298,"my_appid",(allocator<char> *)&resp_6);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"my_secret",&local_2b9);
    this = (RamUpdateUserRequestType *)aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string(local_298);
    std::__cxx11::string::~string((string *)&req_6);
    if (this == (RamUpdateUserRequestType *)0x0) {
      aliyun::RamAddUserToGroupRequestType::~RamAddUserToGroupRequestType
                ((RamAddUserToGroupRequestType *)&req);
      req.account_id._M_string_length = 0;
      req.account_id.field_2._M_allocated_capacity =
           req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
      _Stack_130._M_p = (pointer)0x0;
      local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
      local_110._M_p = (pointer)0x0;
      local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
      req.account_id._M_dataplus._M_p = (pointer)paVar1;
      local_138._M_p = local_128;
      local_118 = (char  [8])local_108;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
      std::__cxx11::string::string<std::allocator<char>>
                (local_298,"my_appid",(allocator<char> *)&resp_6);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"my_secret",&local_2b9);
      this = (RamUpdateUserRequestType *)aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string(local_298);
      std::__cxx11::string::~string((string *)&req_6);
      if (this == (RamUpdateUserRequestType *)0x0) {
        aliyun::RamAttachPolicyToGroupRequestType::~RamAttachPolicyToGroupRequestType
                  ((RamAttachPolicyToGroupRequestType *)&req);
        req.account_id._M_string_length = 0;
        req.account_id.field_2._M_allocated_capacity =
             req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
        _Stack_130._M_p = (pointer)0x0;
        local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
        local_110._M_p = (pointer)0x0;
        local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
        req.account_id._M_dataplus._M_p = (pointer)paVar1;
        local_138._M_p = local_128;
        local_118 = (char  [8])local_108;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_298,"my_appid",(allocator<char> *)&resp_6);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_278,"my_secret",&local_2b9);
        this = (RamUpdateUserRequestType *)aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278)
        ;
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string(local_298);
        std::__cxx11::string::~string((string *)&req_6);
        if (this == (RamUpdateUserRequestType *)0x0) {
          aliyun::RamAttachPolicyToRoleRequestType::~RamAttachPolicyToRoleRequestType
                    ((RamAttachPolicyToRoleRequestType *)&req);
          req.account_id._M_string_length = 0;
          req.account_id.field_2._M_allocated_capacity =
               req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
          _Stack_130._M_p = (pointer)0x0;
          local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
          local_110._M_p = (pointer)0x0;
          local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
          req.account_id._M_dataplus._M_p = (pointer)paVar1;
          local_138._M_p = local_128;
          local_118 = (char  [8])local_108;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_298,"my_appid",(allocator<char> *)&resp_6);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_278,"my_secret",&local_2b9);
          this = (RamUpdateUserRequestType *)
                 aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string(local_298);
          std::__cxx11::string::~string((string *)&req_6);
          if (this == (RamUpdateUserRequestType *)0x0) {
            aliyun::RamAttachPolicyToUserRequestType::~RamAttachPolicyToUserRequestType
                      ((RamAttachPolicyToUserRequestType *)&req);
            req.account_id._M_string_length = 0;
            req.account_id.field_2._M_allocated_capacity =
                 req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
            _Stack_130._M_p = (pointer)0x0;
            local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
            local_110._M_p = (pointer)0x0;
            local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
            local_f8 = (char  [8])&local_e8;
            local_f0 = 0;
            local_e8._M_local_buf[0] = '\0';
            req.account_id._M_dataplus._M_p = (pointer)paVar1;
            local_138._M_p = local_128;
            local_118 = (char  [8])local_108;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_298,"my_appid",(allocator<char> *)&resp_6);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_278,"my_secret",&local_2b9);
            this = (RamUpdateUserRequestType *)
                   aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::~string(local_298);
            std::__cxx11::string::~string((string *)&req_6);
            if (this == (RamUpdateUserRequestType *)0x0) {
              aliyun::RamBindMFADeviceRequestType::~RamBindMFADeviceRequestType
                        ((RamBindMFADeviceRequestType *)&req);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&req,"cn-hangzhou",(allocator<char> *)&local_278);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&req_6,"my_appid",(allocator<char> *)&local_258);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_298,"my_secret",(allocator<char> *)&resp);
              this = (RamUpdateUserRequestType *)aliyun::Ram::CreateRamClient(&req,&req_6,local_298)
              ;
              std::__cxx11::string::~string(local_298);
              std::__cxx11::string::~string((string *)&req_6);
              std::__cxx11::string::~string((string *)&req);
              if (this == (RamUpdateUserRequestType *)0x0) {
                paVar2 = &req_6.user_name.field_2;
                req_6.user_name._M_string_length = 0;
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                _Stack_130._M_p = (pointer)0x0;
                local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                local_110._M_p = (pointer)0x0;
                req_6.user_name.field_2._M_allocated_capacity =
                     req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
                local_f8 = (char  [8])&local_e8;
                local_f0 = 0;
                local_e8._M_local_buf[0] = '\0';
                req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                local_138._M_p = local_128;
                local_118 = (char  [8])local_108;
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"127.0.0.1:12234",(allocator<char> *)&resp);
                  aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp,
                             "{  \"AccessKey\": {    \"AccessKeyId\": \"AccessKeyId\",    \"AccessKeySecret\": \"AccessKeySecret\",    \"Status\": \"Status\",    \"CreateDate\": \"CreateDate\"  }}"
                             ,&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                  std::__cxx11::string::~string((string *)&resp);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req_6);
                  aliyun::Ram::CreateAccessKey
                            ((RamCreateAccessKeyRequestType *)this,
                             (RamCreateAccessKeyResponseType *)&req_6,(RamErrorInfo *)&req);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                aliyun::RamCreateAccessKeyAccessKeyType::~RamCreateAccessKeyAccessKeyType
                          ((RamCreateAccessKeyAccessKeyType *)&req);
                std::__cxx11::string::~string((string *)&req_6);
                req_6.user_name._M_string_length = 0;
                req_6.user_name.field_2._M_allocated_capacity =
                     req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_1f8._M_p = local_1e8;
                local_1f0._M_p = (pointer)0x0;
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                _Stack_130._M_p = (pointer)0x0;
                local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
                local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                local_110._M_p = (pointer)0x0;
                local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
                req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                local_138._M_p = local_128;
                local_118 = (char  [8])local_108;
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"127.0.0.1:12234",(allocator<char> *)&resp);
                  aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp,
                             "{  \"Group\": {    \"GroupName\": \"GroupName\",    \"Comments\": \"Comments\",    \"CreateDate\": \"CreateDate\"  }}"
                             ,&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                  std::__cxx11::string::~string((string *)&resp);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req_6);
                  std::__cxx11::string::assign((char *)&local_1f8);
                  aliyun::Ram::CreateGroup
                            ((RamCreateGroupRequestType *)this,(RamCreateGroupResponseType *)&req_6,
                             (RamErrorInfo *)&req);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                aliyun::RamCreateGroupGroupType::~RamCreateGroupGroupType
                          ((RamCreateGroupGroupType *)&req);
                aliyun::RamCreateGroupRequestType::~RamCreateGroupRequestType
                          ((RamCreateGroupRequestType *)&req_6);
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                _Stack_130._M_p = (pointer)0x0;
                local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                local_110._M_p = (pointer)0x0;
                local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
                local_f8 = (char  [8])&local_e8;
                local_f0 = 0;
                req_6.user_name._M_string_length = 0;
                local_e8._M_local_buf[0] = '\0';
                req_6.user_name.field_2._M_allocated_capacity =
                     req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_1f0._M_p = local_1e8 + 8;
                local_1e8._0_8_ = 0;
                local_1e8[8] = '\0';
                req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                local_138._M_p = local_128;
                local_118 = (char  [8])local_108;
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"127.0.0.1:12234",(allocator<char> *)&resp);
                  aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp,
                             "{  \"LoginProfile\": {    \"UserName\": \"UserName\",    \"PasswordResetRequired\": true,    \"MFABindRequired\": true,    \"CreateDate\": \"CreateDate\"  }}"
                             ,&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                  std::__cxx11::string::~string((string *)&resp);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  std::__cxx11::string::assign((char *)&local_138);
                  std::__cxx11::string::assign(local_118);
                  std::__cxx11::string::assign(local_f8);
                  aliyun::Ram::CreateLoginProfile
                            ((RamCreateLoginProfileRequestType *)this,
                             (RamCreateLoginProfileResponseType *)&req,(RamErrorInfo *)&req_6);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                aliyun::RamCreateLoginProfileLoginProfileType::
                ~RamCreateLoginProfileLoginProfileType
                          ((RamCreateLoginProfileLoginProfileType *)&req_6);
                aliyun::RamCreateLoginProfileRequestType::~RamCreateLoginProfileRequestType
                          ((RamCreateLoginProfileRequestType *)&req);
                req_6.user_name._M_string_length = 0;
                req_6.user_name.field_2._M_allocated_capacity =
                     req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_1f8._M_p = local_1e8;
                local_1f0._M_p = (pointer)0x0;
                local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
                local_1d8 = (char  [8])&local_1c8;
                local_1d0._M_p = (pointer)0x0;
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                _Stack_130._M_p = (pointer)0x0;
                local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                local_110._M_p = (pointer)0x0;
                local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
                local_f8 = (char  [8])&local_e8;
                local_f0 = 0;
                local_1c8._M_local_buf[0] = '\0';
                local_e8._M_local_buf[0] = '\0';
                local_d8._M_p = (pointer)&local_c8;
                local_d0 = 0;
                local_c8._M_local_buf[0] = '\0';
                req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                local_138._M_p = local_128;
                local_118 = (char  [8])local_108;
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"127.0.0.1:12234",(allocator<char> *)&resp);
                  aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp,
                             "{  \"Policy\": {    \"PolicyName\": \"PolicyName\",    \"PolicyType\": \"PolicyType\",    \"Description\": \"Description\",    \"DefaultVersion\": \"DefaultVersion\",    \"CreateDate\": \"CreateDate\"  }}"
                             ,&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                  std::__cxx11::string::~string((string *)&resp);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req_6);
                  std::__cxx11::string::assign((char *)&local_1f8);
                  std::__cxx11::string::assign(local_1d8);
                  aliyun::Ram::CreatePolicy
                            ((RamCreatePolicyRequestType *)this,
                             (RamCreatePolicyResponseType *)&req_6,(RamErrorInfo *)&req);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                aliyun::RamCreatePolicyPolicyType::~RamCreatePolicyPolicyType
                          ((RamCreatePolicyPolicyType *)&req);
                aliyun::RamCreatePolicyRequestType::~RamCreatePolicyRequestType
                          ((RamCreatePolicyRequestType *)&req_6);
                req_6.user_name._M_string_length = 0;
                req_6.user_name.field_2._M_allocated_capacity =
                     req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_1f8._M_p = local_1e8;
                local_1f0._M_p = (pointer)0x0;
                local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
                local_1d8 = (char  [8])&local_1c8;
                local_1d0._M_p = (pointer)0x0;
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                _Stack_130._M_p = local_128 + 8;
                local_128._0_8_ = 0;
                local_1c8._M_local_buf[0] = '\0';
                local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
                local_110._M_p = local_108 + 8;
                local_108._0_8_ = 0;
                local_108[8] = '\0';
                req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"127.0.0.1:12234",(allocator<char> *)&resp);
                  aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp,
                             "{  \"PolicyVersion\": {    \"VersionId\": \"VersionId\",    \"IsDefaultVersion\": true,    \"PolicyDocument\": \"PolicyDocument\",    \"CreateDate\": \"CreateDate\"  }}"
                             ,&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                  std::__cxx11::string::~string((string *)&resp);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req_6);
                  std::__cxx11::string::assign((char *)&local_1f8);
                  std::__cxx11::string::assign(local_1d8);
                  aliyun::Ram::CreatePolicyVersion
                            ((RamCreatePolicyVersionRequestType *)this,
                             (RamCreatePolicyVersionResponseType *)&req_6,(RamErrorInfo *)&req);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                aliyun::RamCreatePolicyVersionPolicyVersionType::
                ~RamCreatePolicyVersionPolicyVersionType
                          ((RamCreatePolicyVersionPolicyVersionType *)&req);
                aliyun::RamCreatePolicyVersionRequestType::~RamCreatePolicyVersionRequestType
                          ((RamCreatePolicyVersionRequestType *)&req_6);
                req_6.user_name._M_string_length = 0;
                req_6.user_name.field_2._M_allocated_capacity =
                     req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_1f8._M_p = local_1e8;
                local_1f0._M_p = (pointer)0x0;
                local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
                local_1d8 = (char  [8])&local_1c8;
                local_1d0._M_p = (pointer)0x0;
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                _Stack_130._M_p = (pointer)0x0;
                local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                local_110._M_p = (pointer)0x0;
                local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
                local_f8 = (char  [8])&local_e8;
                local_f0 = 0;
                local_e8._M_local_buf[0] = '\0';
                local_d8._M_p = (pointer)&local_c8;
                local_d0 = 0;
                local_1c8._M_local_buf[0] = '\0';
                local_c8._M_local_buf[0] = '\0';
                local_b8._M_p = (pointer)&local_a8;
                local_b0 = 0;
                local_a8._M_local_buf[0] = '\0';
                req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                local_138._M_p = local_128;
                local_118 = (char  [8])local_108;
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"127.0.0.1:12234",(allocator<char> *)&resp);
                  aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp,
                             "{  \"Role\": {    \"RoleId\": \"RoleId\",    \"RoleName\": \"RoleName\",    \"Arn\": \"Arn\",    \"Description\": \"Description\",    \"AssumeRolePolicyDocument\": \"AssumeRolePolicyDocument\",    \"CreateDate\": \"CreateDate\"  }}"
                             ,&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                  std::__cxx11::string::~string((string *)&resp);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req_6);
                  std::__cxx11::string::assign((char *)&local_1f8);
                  std::__cxx11::string::assign(local_1d8);
                  aliyun::Ram::CreateRole
                            ((RamCreateRoleRequestType *)this,(RamCreateRoleResponseType *)&req_6,
                             (RamErrorInfo *)&req);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                aliyun::RamCreateRoleRoleType::~RamCreateRoleRoleType((RamCreateRoleRoleType *)&req)
                ;
                aliyun::RamCreateRoleRequestType::~RamCreateRoleRequestType
                          ((RamCreateRoleRequestType *)&req_6);
                req_6.user_name._M_string_length = 0;
                req_6.user_name.field_2._M_allocated_capacity =
                     req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_1f8._M_p = local_1e8;
                local_1f0._M_p = (pointer)0x0;
                local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
                local_1d8 = (char  [8])&local_1c8;
                local_1d0._M_p = (pointer)0x0;
                local_1c8._M_local_buf[0] = '\0';
                local_1b8 = (char  [8])&local_1a8;
                local_1b0 = 0;
                local_1a8._M_local_buf[0] = '\0';
                local_198._M_p = (pointer)&local_188;
                local_190 = 0;
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                _Stack_130._M_p = (pointer)0x0;
                local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                local_110._M_p = (pointer)0x0;
                local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
                local_f8 = (char  [8])&local_e8;
                local_f0 = 0;
                local_e8._M_local_buf[0] = '\0';
                local_d8._M_p = (pointer)&local_c8;
                local_d0 = 0;
                local_c8._M_local_buf[0] = '\0';
                local_b8._M_p = (pointer)&local_a8;
                local_b0 = 0;
                local_188._M_local_buf[0] = '\0';
                local_a8._M_local_buf[0] = '\0';
                local_98._M_p = (pointer)&local_88;
                local_90 = 0;
                local_88._M_local_buf[0] = '\0';
                req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                local_138._M_p = local_128;
                local_118 = (char  [8])local_108;
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"127.0.0.1:12234",(allocator<char> *)&resp);
                  aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp,
                             "{  \"User\": {    \"UserId\": \"UserId\",    \"UserName\": \"UserName\",    \"DisplayName\": \"DisplayName\",    \"MobilePhone\": \"MobilePhone\",    \"Email\": \"Email\",    \"Comments\": \"Comments\",    \"CreateDate\": \"CreateDate\"  }}"
                             ,&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                  std::__cxx11::string::~string((string *)&resp);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req_6);
                  std::__cxx11::string::assign((char *)&local_1f8);
                  std::__cxx11::string::assign(local_1d8);
                  std::__cxx11::string::assign(local_1b8);
                  std::__cxx11::string::assign((char *)&local_198);
                  aliyun::Ram::CreateUser
                            ((RamCreateUserRequestType *)this,(RamCreateUserResponseType *)&req_6,
                             (RamErrorInfo *)&req);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                aliyun::RamCreateUserUserType::~RamCreateUserUserType((RamCreateUserUserType *)&req)
                ;
                aliyun::RamCreateUserRequestType::~RamCreateUserRequestType
                          ((RamCreateUserRequestType *)&req_6);
                req_6.user_name._M_string_length = 0;
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                _Stack_130._M_p = (pointer)0x0;
                req_6.user_name.field_2._M_allocated_capacity =
                     req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                local_110._M_p = (pointer)0x0;
                local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
                req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                local_138._M_p = local_128;
                local_118 = (char  [8])local_108;
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"127.0.0.1:12234",(allocator<char> *)&resp);
                  aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp,
                             "{  \"VirtualMFADevice\": {    \"SerialNumber\": \"SerialNumber\",    \"Base32StringSeed\": \"Base32StringSeed\",    \"QRCodePNG\": \"QRCodePNG\"  }}"
                             ,&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                  std::__cxx11::string::~string((string *)&resp);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req_6);
                  aliyun::Ram::CreateVirtualMFADevice
                            ((RamCreateVirtualMFADeviceRequestType *)this,
                             (RamCreateVirtualMFADeviceResponseType *)&req_6,(RamErrorInfo *)&req);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                aliyun::RamCreateVirtualMFADeviceVirtualMFADeviceType::
                ~RamCreateVirtualMFADeviceVirtualMFADeviceType
                          ((RamCreateVirtualMFADeviceVirtualMFADeviceType *)&req);
                std::__cxx11::string::~string((string *)&req_6);
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"my_appid",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                std::__cxx11::string::~string((string *)&req_6);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
                  aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"{}",&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  aliyun::Ram::DeactivateService
                            ((RamDeactivateServiceRequestType *)this,
                             (RamDeactivateServiceResponseType *)&req,(RamErrorInfo *)&resp);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                std::__cxx11::string::~string((string *)&req);
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                _Stack_130._M_p = (pointer)0x0;
                local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                local_138._M_p = local_128;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"my_appid",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                std::__cxx11::string::~string((string *)&req_6);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
                  aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"{}",&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  std::__cxx11::string::assign((char *)&local_138);
                  aliyun::Ram::DeleteAccessKey
                            ((RamDeleteAccessKeyRequestType *)this,
                             (RamDeleteAccessKeyResponseType *)&req,(RamErrorInfo *)&resp);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                aliyun::RamDeleteAccessKeyRequestType::~RamDeleteAccessKeyRequestType
                          ((RamDeleteAccessKeyRequestType *)&req);
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"my_appid",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                std::__cxx11::string::~string((string *)&req_6);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
                  aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"{}",&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  aliyun::Ram::DeleteGroup
                            ((RamDeleteGroupRequestType *)this,(RamDeleteGroupResponseType *)&req,
                             (RamErrorInfo *)&resp);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                std::__cxx11::string::~string((string *)&req);
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"my_appid",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                std::__cxx11::string::~string((string *)&req_6);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
                  aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"{}",&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  aliyun::Ram::DeleteLoginProfile
                            ((RamDeleteLoginProfileRequestType *)this,
                             (RamDeleteLoginProfileResponseType *)&req,(RamErrorInfo *)&resp);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                std::__cxx11::string::~string((string *)&req);
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"my_appid",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                std::__cxx11::string::~string((string *)&req_6);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
                  aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"{}",&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  aliyun::Ram::DeletePolicy
                            ((RamDeletePolicyRequestType *)this,(RamDeletePolicyResponseType *)&req,
                             (RamErrorInfo *)&resp);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                std::__cxx11::string::~string((string *)&req);
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                _Stack_130._M_p = (pointer)0x0;
                local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                local_138._M_p = local_128;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"my_appid",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                std::__cxx11::string::~string((string *)&req_6);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
                  aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"{}",&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  std::__cxx11::string::assign((char *)&local_138);
                  aliyun::Ram::DeletePolicyVersion
                            ((RamDeletePolicyVersionRequestType *)this,
                             (RamDeletePolicyVersionResponseType *)&req,(RamErrorInfo *)&resp);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                aliyun::RamDeletePolicyVersionRequestType::~RamDeletePolicyVersionRequestType
                          ((RamDeletePolicyVersionRequestType *)&req);
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"my_appid",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                std::__cxx11::string::~string((string *)&req_6);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
                  aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"{}",&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  aliyun::Ram::DeleteRole
                            ((RamDeleteRoleRequestType *)this,(RamDeleteRoleResponseType *)&req,
                             (RamErrorInfo *)&resp);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                std::__cxx11::string::~string((string *)&req);
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"my_appid",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                std::__cxx11::string::~string((string *)&req_6);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
                  aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"{}",&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  aliyun::Ram::DeleteUser
                            ((RamDeleteUserRequestType *)this,(RamDeleteUserResponseType *)&req,
                             (RamErrorInfo *)&resp);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                std::__cxx11::string::~string((string *)&req);
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"my_appid",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                std::__cxx11::string::~string((string *)&req_6);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
                  aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"{}",&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  aliyun::Ram::DeleteVirtualMFADevice
                            ((RamDeleteVirtualMFADeviceRequestType *)this,
                             (RamDeleteVirtualMFADeviceResponseType *)&req,(RamErrorInfo *)&resp);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                std::__cxx11::string::~string((string *)&req);
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                _Stack_130._M_p = (pointer)0x0;
                local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                local_110._M_p = (pointer)0x0;
                local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                local_138._M_p = local_128;
                local_118 = (char  [8])local_108;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"my_appid",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                std::__cxx11::string::~string((string *)&req_6);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
                  aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"{}",&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  std::__cxx11::string::assign((char *)&local_138);
                  std::__cxx11::string::assign(local_118);
                  aliyun::Ram::DetachPolicyFromGroup
                            ((RamDetachPolicyFromGroupRequestType *)this,
                             (RamDetachPolicyFromGroupResponseType *)&req,(RamErrorInfo *)&resp);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                aliyun::RamDetachPolicyFromGroupRequestType::~RamDetachPolicyFromGroupRequestType
                          ((RamDetachPolicyFromGroupRequestType *)&req);
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                _Stack_130._M_p = (pointer)0x0;
                local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                local_110._M_p = (pointer)0x0;
                local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                local_138._M_p = local_128;
                local_118 = (char  [8])local_108;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"my_appid",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                std::__cxx11::string::~string((string *)&req_6);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
                  aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"{}",&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  std::__cxx11::string::assign((char *)&local_138);
                  std::__cxx11::string::assign(local_118);
                  aliyun::Ram::DetachPolicyFromRole
                            ((RamDetachPolicyFromRoleRequestType *)this,
                             (RamDetachPolicyFromRoleResponseType *)&req,(RamErrorInfo *)&resp);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                aliyun::RamDetachPolicyFromRoleRequestType::~RamDetachPolicyFromRoleRequestType
                          ((RamDetachPolicyFromRoleRequestType *)&req);
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                _Stack_130._M_p = (pointer)0x0;
                local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                local_110._M_p = (pointer)0x0;
                local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                local_138._M_p = local_128;
                local_118 = (char  [8])local_108;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"my_appid",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_secret",&local_2b9);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                std::__cxx11::string::~string((string *)&req_6);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
                  aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"{}",&local_2b9);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  std::__cxx11::string::assign((char *)&local_138);
                  std::__cxx11::string::assign(local_118);
                  aliyun::Ram::DetachPolicyFromUser
                            ((RamDetachPolicyFromUserRequestType *)this,
                             (RamDetachPolicyFromUserResponseType *)&req,(RamErrorInfo *)&resp);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                aliyun::RamDetachPolicyFromUserRequestType::~RamDetachPolicyFromUserRequestType
                          ((RamDetachPolicyFromUserRequestType *)&req);
                req.account_id._M_string_length = 0;
                req.account_id.field_2._M_allocated_capacity =
                     req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"my_appid",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_secret",(allocator<char> *)&resp);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                std::__cxx11::string::~string((string *)&req_6);
                if (this != (RamUpdateUserRequestType *)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
                  aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,"{  \"AccountAlias\": \"AccountAlias\"}",
                             (allocator<char> *)&resp);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  HttpTestListener::Start(this_00);
                  aliyun::Ram::GetAccountAlias
                            ((RamGetAccountAliasResponseType *)this,(RamErrorInfo *)&req);
                  HttpTestListener::WaitComplete(this_00);
                  goto LAB_0010fc73;
                }
                std::__cxx11::string::~string((string *)&req);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_298,"my_appid",(allocator<char> *)&resp_6);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"my_secret",(allocator<char> *)&resp);
                this = (RamUpdateUserRequestType *)
                       aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string(local_298);
                std::__cxx11::string::~string((string *)&req_6);
                if (this == (RamUpdateUserRequestType *)0x0) {
                  req_6.user_name._M_string_length = 0;
                  req.account_id._M_string_length = 0;
                  req.account_id.field_2._M_allocated_capacity =
                       req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  _Stack_130._M_p = (pointer)0x0;
                  local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                  local_110._M_p = (pointer)0x0;
                  req_6.user_name.field_2._M_allocated_capacity =
                       req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
                  local_f8 = (char  [8])&local_e8;
                  local_f0 = 0;
                  local_e8._M_local_buf[0] = '\0';
                  req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                  req.account_id._M_dataplus._M_p = (pointer)paVar1;
                  local_138._M_p = local_128;
                  local_118 = (char  [8])local_108;
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_258,"my_secret",&local_2b9);
                  this = (RamUpdateUserRequestType *)
                         aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  std::__cxx11::string::~string((string *)&local_278);
                  std::__cxx11::string::~string(local_298);
                  if (this != (RamUpdateUserRequestType *)0x0) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&resp_6,"127.0.0.1:12234",(allocator<char> *)&resp);
                    aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                    std::__cxx11::string::~string((string *)&resp_6);
                    if ((char)(this->new_user_name)._M_string_length == '\x01') {
                      *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                    }
                    this_00 = (HttpTestListener *)operator_new(0x180);
                    HttpTestListener::HttpTestListener(this_00,0x2fca);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&resp,
                               "{  \"Group\": {    \"GroupName\": \"GroupName\",    \"Comments\": \"Comments\",    \"CreateDate\": \"CreateDate\",    \"UpdateDate\": \"UpdateDate\"  }}"
                               ,&local_2b9);
                    HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                    std::__cxx11::string::~string((string *)&resp);
                    HttpTestListener::Start(this_00);
                    std::__cxx11::string::assign((char *)&req_6);
                    aliyun::Ram::GetGroup
                              ((RamGetGroupRequestType *)this,(RamGetGroupResponseType *)&req_6,
                               (RamErrorInfo *)&req);
                    HttpTestListener::WaitComplete(this_00);
                    goto LAB_0010fc73;
                  }
                  aliyun::RamGetGroupGroupType::~RamGetGroupGroupType((RamGetGroupGroupType *)&req);
                  std::__cxx11::string::~string((string *)&req_6);
                  req_6.user_name._M_string_length = 0;
                  req.account_id._M_string_length = 0;
                  req_6.user_name.field_2._M_allocated_capacity =
                       req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  req.account_id.field_2._M_allocated_capacity =
                       req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  _Stack_130._M_p = local_128 + 8;
                  local_128._0_8_ = 0;
                  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
                  req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                  req.account_id._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_258,"my_secret",&local_2b9);
                  this = (RamUpdateUserRequestType *)
                         aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  std::__cxx11::string::~string((string *)&local_278);
                  std::__cxx11::string::~string(local_298);
                  if (this != (RamUpdateUserRequestType *)0x0) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&resp_6,"127.0.0.1:12234",(allocator<char> *)&resp);
                    aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                    std::__cxx11::string::~string((string *)&resp_6);
                    if ((char)(this->new_user_name)._M_string_length == '\x01') {
                      *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                    }
                    this_00 = (HttpTestListener *)operator_new(0x180);
                    HttpTestListener::HttpTestListener(this_00,0x2fca);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&resp,
                               "{  \"LoginProfile\": {    \"UserName\": \"UserName\",    \"PasswordResetRequired\": true,    \"MFABindRequired\": true,    \"CreateDate\": \"CreateDate\"  }}"
                               ,&local_2b9);
                    HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                    std::__cxx11::string::~string((string *)&resp);
                    HttpTestListener::Start(this_00);
                    std::__cxx11::string::assign((char *)&req_6);
                    aliyun::Ram::GetLoginProfile
                              ((RamGetLoginProfileRequestType *)this,
                               (RamGetLoginProfileResponseType *)&req_6,(RamErrorInfo *)&req);
                    HttpTestListener::WaitComplete(this_00);
                    goto LAB_0010fc73;
                  }
                  aliyun::RamGetLoginProfileLoginProfileType::~RamGetLoginProfileLoginProfileType
                            ((RamGetLoginProfileLoginProfileType *)&req);
                  std::__cxx11::string::~string((string *)&req_6);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&req,"cn-hangzhou",(allocator<char> *)&local_278);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&req_6,"my_appid",(allocator<char> *)&local_258);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_298,"my_secret",(allocator<char> *)&resp);
                  this = (RamUpdateUserRequestType *)
                         aliyun::Ram::CreateRamClient(&req,&req_6,local_298);
                  std::__cxx11::string::~string(local_298);
                  std::__cxx11::string::~string((string *)&req_6);
                  std::__cxx11::string::~string((string *)&req);
                  if (this == (RamUpdateUserRequestType *)0x0) {
                    req_6.user_name._M_string_length = 0;
                    req_6.user_name.field_2._M_allocated_capacity =
                         req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    local_1f8._M_p = local_1e8;
                    local_1f0._M_p = (pointer)0x0;
                    req.account_id._M_string_length = 0;
                    req.account_id.field_2._M_allocated_capacity =
                         req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    _Stack_130._M_p = (pointer)0x0;
                    local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                    local_110._M_p = (pointer)0x0;
                    local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
                    local_f8 = (char  [8])&local_e8;
                    local_f0 = 0;
                    local_e8._M_local_buf[0] = '\0';
                    local_d8._M_p = (pointer)&local_c8;
                    local_d0 = 0;
                    local_c8._M_local_buf[0] = '\0';
                    local_b8._M_p = (pointer)&local_a8;
                    local_b0 = 0;
                    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
                    local_a8._M_local_buf[0] = '\0';
                    local_98._M_p = (pointer)&local_88;
                    local_90 = 0;
                    local_88._M_local_buf[0] = '\0';
                    req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                    req.account_id._M_dataplus._M_p = (pointer)paVar1;
                    local_138._M_p = local_128;
                    local_118 = (char  [8])local_108;
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_258,"my_secret",&local_2b9);
                    this = (RamUpdateUserRequestType *)
                           aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                    std::__cxx11::string::~string((string *)&local_258);
                    std::__cxx11::string::~string((string *)&local_278);
                    std::__cxx11::string::~string(local_298);
                    if (this != (RamUpdateUserRequestType *)0x0) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&resp_6,"127.0.0.1:12234",(allocator<char> *)&resp);
                      aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                      std::__cxx11::string::~string((string *)&resp_6);
                      if ((char)(this->new_user_name)._M_string_length == '\x01') {
                        *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                      }
                      this_00 = (HttpTestListener *)operator_new(0x180);
                      HttpTestListener::HttpTestListener(this_00,0x2fca);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&resp,
                                 "{  \"Policy\": {    \"PolicyName\": \"PolicyName\",    \"PolicyType\": \"PolicyType\",    \"Description\": \"Description\",    \"DefaultVersion\": \"DefaultVersion\",    \"PolicyDocument\": \"PolicyDocument\",    \"CreateDate\": \"CreateDate\",    \"UpdateDate\": \"UpdateDate\",    \"AttachmentCount\": 0  }}"
                                 ,&local_2b9);
                      HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                      std::__cxx11::string::~string((string *)&resp);
                      HttpTestListener::Start(this_00);
                      std::__cxx11::string::assign((char *)&req_6);
                      std::__cxx11::string::assign((char *)&local_1f8);
                      aliyun::Ram::GetPolicy
                                ((RamGetPolicyRequestType *)this,(RamGetPolicyResponseType *)&req_6,
                                 (RamErrorInfo *)&req);
                      HttpTestListener::WaitComplete(this_00);
                      goto LAB_0010fc73;
                    }
                    aliyun::RamGetPolicyPolicyType::~RamGetPolicyPolicyType
                              ((RamGetPolicyPolicyType *)&req);
                    aliyun::RamGetPolicyRequestType::~RamGetPolicyRequestType
                              ((RamGetPolicyRequestType *)&req_6);
                    req_6.user_name._M_string_length = 0;
                    req_6.user_name.field_2._M_allocated_capacity =
                         req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    local_1f8._M_p = local_1e8;
                    local_1f0._M_p = (pointer)0x0;
                    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
                    local_1d8 = (char  [8])&local_1c8;
                    local_1d0._M_p = (pointer)0x0;
                    req.account_id._M_string_length = 0;
                    req.account_id.field_2._M_allocated_capacity =
                         req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    _Stack_130._M_p = local_128 + 8;
                    local_128._0_8_ = 0;
                    local_1c8._M_local_buf[0] = '\0';
                    local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
                    local_110._M_p = local_108 + 8;
                    local_108._0_8_ = 0;
                    local_108[8] = '\0';
                    req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                    req.account_id._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_258,"my_secret",&local_2b9);
                    this = (RamUpdateUserRequestType *)
                           aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                    std::__cxx11::string::~string((string *)&local_258);
                    std::__cxx11::string::~string((string *)&local_278);
                    std::__cxx11::string::~string(local_298);
                    if (this != (RamUpdateUserRequestType *)0x0) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&resp_6,"127.0.0.1:12234",(allocator<char> *)&resp);
                      aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                      std::__cxx11::string::~string((string *)&resp_6);
                      if ((char)(this->new_user_name)._M_string_length == '\x01') {
                        *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                      }
                      this_00 = (HttpTestListener *)operator_new(0x180);
                      HttpTestListener::HttpTestListener(this_00,0x2fca);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&resp,
                                 "{  \"PolicyVersion\": {    \"VersionId\": \"VersionId\",    \"IsDefaultVersion\": true,    \"PolicyDocument\": \"PolicyDocument\",    \"CreateDate\": \"CreateDate\"  }}"
                                 ,&local_2b9);
                      HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                      std::__cxx11::string::~string((string *)&resp);
                      HttpTestListener::Start(this_00);
                      std::__cxx11::string::assign((char *)&req_6);
                      std::__cxx11::string::assign((char *)&local_1f8);
                      std::__cxx11::string::assign(local_1d8);
                      aliyun::Ram::GetPolicyVersion
                                ((RamGetPolicyVersionRequestType *)this,
                                 (RamGetPolicyVersionResponseType *)&req_6,(RamErrorInfo *)&req);
                      HttpTestListener::WaitComplete(this_00);
                      goto LAB_0010fc73;
                    }
                    aliyun::RamGetPolicyVersionPolicyVersionType::
                    ~RamGetPolicyVersionPolicyVersionType
                              ((RamGetPolicyVersionPolicyVersionType *)&req);
                    aliyun::RamGetPolicyVersionRequestType::~RamGetPolicyVersionRequestType
                              ((RamGetPolicyVersionRequestType *)&req_6);
                    req_6.user_name._M_string_length = 0;
                    req.account_id._M_string_length = 0;
                    req.account_id.field_2._M_allocated_capacity =
                         req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    _Stack_130._M_p = (pointer)0x0;
                    local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                    local_110._M_p = (pointer)0x0;
                    local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
                    local_f8 = (char  [8])&local_e8;
                    local_f0 = 0;
                    local_e8._M_local_buf[0] = '\0';
                    local_d8._M_p = (pointer)&local_c8;
                    local_d0 = 0;
                    local_c8._M_local_buf[0] = '\0';
                    local_b8._M_p = (pointer)&local_a8;
                    local_b0 = 0;
                    req_6.user_name.field_2._M_allocated_capacity =
                         req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    local_a8._M_local_buf[0] = '\0';
                    local_98._M_p = (pointer)&local_88;
                    local_90 = 0;
                    local_88._M_local_buf[0] = '\0';
                    req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                    req.account_id._M_dataplus._M_p = (pointer)paVar1;
                    local_138._M_p = local_128;
                    local_118 = (char  [8])local_108;
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_258,"my_secret",&local_2b9);
                    this = (RamUpdateUserRequestType *)
                           aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                    std::__cxx11::string::~string((string *)&local_258);
                    std::__cxx11::string::~string((string *)&local_278);
                    std::__cxx11::string::~string(local_298);
                    if (this != (RamUpdateUserRequestType *)0x0) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&resp_6,"127.0.0.1:12234",(allocator<char> *)&resp);
                      aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                      std::__cxx11::string::~string((string *)&resp_6);
                      if ((char)(this->new_user_name)._M_string_length == '\x01') {
                        *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                      }
                      this_00 = (HttpTestListener *)operator_new(0x180);
                      HttpTestListener::HttpTestListener(this_00,0x2fca);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&resp,
                                 "{  \"Role\": {    \"RoleId\": \"RoleId\",    \"RoleName\": \"RoleName\",    \"Arn\": \"Arn\",    \"Description\": \"Description\",    \"AssumeRolePolicyDocument\": \"AssumeRolePolicyDocument\",    \"CreateDate\": \"CreateDate\",    \"UpdateDate\": \"UpdateDate\"  }}"
                                 ,&local_2b9);
                      HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                      std::__cxx11::string::~string((string *)&resp);
                      HttpTestListener::Start(this_00);
                      std::__cxx11::string::assign((char *)&req_6);
                      aliyun::Ram::GetRole
                                ((RamGetRoleRequestType *)this,(RamGetRoleResponseType *)&req_6,
                                 (RamErrorInfo *)&req);
                      HttpTestListener::WaitComplete(this_00);
                      goto LAB_0010fc73;
                    }
                    aliyun::RamGetRoleRoleType::~RamGetRoleRoleType((RamGetRoleRoleType *)&req);
                    std::__cxx11::string::~string((string *)&req_6);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&req,"cn-hangzhou",(allocator<char> *)&local_278);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&req_6,"my_appid",(allocator<char> *)&local_258);
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_298,"my_secret",(allocator<char> *)&resp);
                    this = (RamUpdateUserRequestType *)
                           aliyun::Ram::CreateRamClient(&req,&req_6,local_298);
                    std::__cxx11::string::~string(local_298);
                    std::__cxx11::string::~string((string *)&req_6);
                    std::__cxx11::string::~string((string *)&req);
                    if (this == (RamUpdateUserRequestType *)0x0) {
                      req.account_id._M_string_length = 0;
                      req.account_id.field_2._M_allocated_capacity =
                           req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      req_6.user_name._M_string_length = 0;
                      req_6.user_name.field_2._M_allocated_capacity =
                           req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                      req.account_id._M_dataplus._M_p = (pointer)paVar1;
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_258,"my_secret",&local_2b9);
                      this = (RamUpdateUserRequestType *)
                             aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                      std::__cxx11::string::~string((string *)&local_258);
                      std::__cxx11::string::~string((string *)&local_278);
                      std::__cxx11::string::~string(local_298);
                      if (this != (RamUpdateUserRequestType *)0x0) goto LAB_0010fc9b;
                      std::__cxx11::string::~string((string *)&req_6);
                      std::__cxx11::string::~string((string *)&req);
                      req_6.user_name._M_string_length = 0;
                      req.account_id._M_string_length = 0;
                      req.account_id.field_2._M_allocated_capacity =
                           req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      _Stack_130._M_p = (pointer)0x0;
                      local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                      local_110._M_p = (pointer)0x0;
                      local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
                      local_f8 = (char  [8])&local_e8;
                      local_f0 = 0;
                      local_e8._M_local_buf[0] = '\0';
                      local_d8._M_p = (pointer)&local_c8;
                      local_d0 = 0;
                      local_c8._M_local_buf[0] = '\0';
                      local_b8._M_p = (pointer)&local_a8;
                      local_b0 = 0;
                      local_a8._M_local_buf[0] = '\0';
                      local_98._M_p = (pointer)&local_88;
                      local_90 = 0;
                      local_88._M_local_buf[0] = '\0';
                      local_78._M_p = (pointer)&local_68;
                      local_70 = 0;
                      req_6.user_name.field_2._M_allocated_capacity =
                           req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      local_68._M_local_buf[0] = '\0';
                      local_58._M_p = (pointer)&local_48;
                      local_50 = 0;
                      local_48._M_local_buf[0] = '\0';
                      req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                      req.account_id._M_dataplus._M_p = (pointer)paVar1;
                      local_138._M_p = local_128;
                      local_118 = (char  [8])local_108;
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_258,"my_secret",&local_2b9);
                      this = (RamUpdateUserRequestType *)
                             aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                      std::__cxx11::string::~string((string *)&local_258);
                      std::__cxx11::string::~string((string *)&local_278);
                      std::__cxx11::string::~string(local_298);
                      if (this == (RamUpdateUserRequestType *)0x0) {
                        aliyun::RamGetUserUserType::~RamGetUserUserType((RamGetUserUserType *)&req);
                        std::__cxx11::string::~string((string *)&req_6);
                        req.account_id._M_string_length = 0;
                        req.account_id.field_2._M_allocated_capacity =
                             req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        req_6.user_name._M_string_length = 0;
                        req_6.user_name.field_2._M_allocated_capacity =
                             req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                        req.account_id._M_dataplus._M_p = (pointer)paVar1;
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_258,"my_secret",&local_2b9);
                        this = (RamUpdateUserRequestType *)
                               aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                        std::__cxx11::string::~string((string *)&local_258);
                        std::__cxx11::string::~string((string *)&local_278);
                        std::__cxx11::string::~string(local_298);
                        if (this == (RamUpdateUserRequestType *)0x0) {
                          std::__cxx11::string::~string((string *)&req_6);
                          std::__cxx11::string::~string((string *)&req);
                          req.account_id._M_string_length = 0;
                          req.account_id.field_2._M_allocated_capacity =
                               req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                          _resp = (pointer)0x0;
                          req.account_id._M_dataplus._M_p = (pointer)paVar1;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&req_6,"cn-hangzhou",(allocator<char> *)&local_258);
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_298,"my_appid",(allocator<char> *)&resp_6);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_278,"my_secret",&local_2b9);
                          this = (RamUpdateUserRequestType *)
                                 aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
                          std::__cxx11::string::~string((string *)&local_278);
                          std::__cxx11::string::~string(local_298);
                          std::__cxx11::string::~string((string *)&req_6);
                          if (this == (RamUpdateUserRequestType *)0x0) {
                            std::
                            vector<aliyun::RamListAccessKeysAccessKeyType,_std::allocator<aliyun::RamListAccessKeysAccessKeyType>_>
                            ::~vector((vector<aliyun::RamListAccessKeysAccessKeyType,_std::allocator<aliyun::RamListAccessKeysAccessKeyType>_>
                                       *)&resp);
                            std::__cxx11::string::~string((string *)&req);
                            req_6.user_name._M_string_length = 0;
                            req_6.user_name.field_2._M_allocated_capacity =
                                 req_6.user_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                            local_1f8._M_p = local_1e8;
                            local_1f0._M_p = (pointer)0x0;
                            local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
                            local_128._0_8_ = 0;
                            local_128._8_8_ = 0;
                            local_138._M_p = (pointer)0x0;
                            _Stack_130._M_p = (pointer)0x0;
                            req.account_id.field_2._M_allocated_capacity = 0;
                            req.account_id.field_2._8_8_ = 0;
                            req.account_id._M_dataplus._M_p = (pointer)0x0;
                            req.account_id._M_string_length = 0;
                            local_118 = (char  [8])0x0;
                            req_6.user_name._M_dataplus._M_p = (pointer)paVar2;
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_258,"my_secret",&local_2b9);
                            this = (RamUpdateUserRequestType *)
                                   aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                            std::__cxx11::string::~string((string *)&local_258);
                            std::__cxx11::string::~string((string *)&local_278);
                            std::__cxx11::string::~string(local_298);
                            if (this == (RamUpdateUserRequestType *)0x0) {
                              aliyun::RamListEntitiesForPolicyResponseType::
                              ~RamListEntitiesForPolicyResponseType
                                        ((RamListEntitiesForPolicyResponseType *)&req);
                              aliyun::RamListEntitiesForPolicyRequestType::
                              ~RamListEntitiesForPolicyRequestType
                                        ((RamListEntitiesForPolicyRequestType *)&req_6);
                              req.account_id._M_string_length = 0;
                              req.account_id.field_2._M_allocated_capacity =
                                   req.account_id.field_2._M_allocated_capacity & 0xffffffffffffff00
                              ;
                              _Stack_130._M_p = (pointer)0x0;
                              local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                              req_6.user_name._M_dataplus._M_p = (pointer)0x0;
                              req_6.user_name._M_string_length = 0;
                              req_6.user_name.field_2._M_allocated_capacity = 0;
                              local_1f8._M_p = local_1e8;
                              local_1f0._M_p = (pointer)0x0;
                              local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
                              req.account_id._M_dataplus._M_p = (pointer)paVar1;
                              local_138._M_p = local_128;
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_278,"my_appid",(allocator<char> *)&resp);
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_258,"my_secret",&local_2b9);
                              this = (RamUpdateUserRequestType *)
                                     aliyun::Ram::CreateRamClient(local_298,&local_278,&local_258);
                              std::__cxx11::string::~string((string *)&local_258);
                              std::__cxx11::string::~string((string *)&local_278);
                              std::__cxx11::string::~string(local_298);
                              if (this == (RamUpdateUserRequestType *)0x0) {
                                aliyun::RamListGroupsResponseType::~RamListGroupsResponseType
                                          ((RamListGroupsResponseType *)&req_6);
                                aliyun::RamListGroupsRequestType::~RamListGroupsRequestType
                                          ((RamListGroupsRequestType *)&req);
                                req.account_id._M_string_length = 0;
                                req.account_id.field_2._M_allocated_capacity =
                                     req.account_id.field_2._M_allocated_capacity &
                                     0xffffffffffffff00;
                                _resp = (pointer)0x0;
                                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&req_6,"cn-hangzhou",
                                           (allocator<char> *)&local_258);
                                std::__cxx11::string::string<std::allocator<char>>
                                          (local_298,"my_appid",(allocator<char> *)&resp_6);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_278,"my_secret",&local_2b9);
                                this = (RamUpdateUserRequestType *)
                                       aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278);
                                std::__cxx11::string::~string((string *)&local_278);
                                std::__cxx11::string::~string(local_298);
                                std::__cxx11::string::~string((string *)&req_6);
                                if (this == (RamUpdateUserRequestType *)0x0) {
                                  std::
                                  vector<aliyun::RamListGroupsForUserGroupType,_std::allocator<aliyun::RamListGroupsForUserGroupType>_>
                                  ::~vector((vector<aliyun::RamListGroupsForUserGroupType,_std::allocator<aliyun::RamListGroupsForUserGroupType>_>
                                             *)&resp);
                                  std::__cxx11::string::~string((string *)&req);
                                  req.account_id._M_string_length = 0;
                                  req.account_id.field_2._M_allocated_capacity =
                                       req.account_id.field_2._M_allocated_capacity &
                                       0xffffffffffffff00;
                                  _Stack_130._M_p = (pointer)0x0;
                                  local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                                  local_110._M_p = (pointer)0x0;
                                  local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
                                  req_6.user_name._M_dataplus._M_p = (pointer)0x0;
                                  req_6.user_name._M_string_length = 0;
                                  req_6.user_name.field_2._M_allocated_capacity = 0;
                                  local_1f8._M_p = local_1e8;
                                  local_1f0._M_p = (pointer)0x0;
                                  local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
                                  req.account_id._M_dataplus._M_p = (pointer)paVar1;
                                  local_138._M_p = local_128;
                                  local_118 = (char  [8])local_108;
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (local_298,"cn-hangzhou",(allocator<char> *)&resp_6);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_278,"my_appid",
                                             (allocator<char> *)&resp);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_258,"my_secret",&local_2b9);
                                  this = (RamUpdateUserRequestType *)
                                         aliyun::Ram::CreateRamClient
                                                   (local_298,&local_278,&local_258);
                                  std::__cxx11::string::~string((string *)&local_258);
                                  std::__cxx11::string::~string((string *)&local_278);
                                  std::__cxx11::string::~string(local_298);
                                  if (this == (RamUpdateUserRequestType *)0x0) {
                                    aliyun::RamListPoliciesResponseType::
                                    ~RamListPoliciesResponseType
                                              ((RamListPoliciesResponseType *)&req_6);
                                    aliyun::RamListPoliciesRequestType::~RamListPoliciesRequestType
                                              ((RamListPoliciesRequestType *)&req);
                                    req.account_id._M_string_length = 0;
                                    req.account_id.field_2._M_allocated_capacity =
                                         req.account_id.field_2._M_allocated_capacity &
                                         0xffffffffffffff00;
                                    _resp = (pointer)0x0;
                                    req.account_id._M_dataplus._M_p = (pointer)paVar1;
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&req_6,"cn-hangzhou",
                                               (allocator<char> *)&local_258);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              (local_298,"my_appid",(allocator<char> *)&resp_6);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_278,"my_secret",&local_2b9);
                                    this = (RamUpdateUserRequestType *)
                                           aliyun::Ram::CreateRamClient(&req_6,local_298,&local_278)
                                    ;
                                    std::__cxx11::string::~string((string *)&local_278);
                                    std::__cxx11::string::~string(local_298);
                                    std::__cxx11::string::~string((string *)&req_6);
                                    if (this == (RamUpdateUserRequestType *)0x0) {
                                      std::
                                      vector<aliyun::RamListPoliciesForGroupPolicyType,_std::allocator<aliyun::RamListPoliciesForGroupPolicyType>_>
                                      ::~vector((vector<aliyun::RamListPoliciesForGroupPolicyType,_std::allocator<aliyun::RamListPoliciesForGroupPolicyType>_>
                                                 *)&resp);
                                      std::__cxx11::string::~string((string *)&req);
                                      req.account_id._M_string_length = 0;
                                      req.account_id.field_2._M_allocated_capacity =
                                           req.account_id.field_2._M_allocated_capacity &
                                           0xffffffffffffff00;
                                      _resp = (pointer)0x0;
                                      req.account_id._M_dataplus._M_p = (pointer)paVar1;
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&req_6,"cn-hangzhou",
                                                 (allocator<char> *)&local_258);
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (local_298,"my_appid",(allocator<char> *)&resp_6);
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_278,"my_secret",&local_2b9);
                                      this = (RamUpdateUserRequestType *)
                                             aliyun::Ram::CreateRamClient
                                                       (&req_6,local_298,&local_278);
                                      std::__cxx11::string::~string((string *)&local_278);
                                      std::__cxx11::string::~string(local_298);
                                      std::__cxx11::string::~string((string *)&req_6);
                                      if (this == (RamUpdateUserRequestType *)0x0) {
                                        std::
                                        vector<aliyun::RamListPoliciesForRolePolicyType,_std::allocator<aliyun::RamListPoliciesForRolePolicyType>_>
                                        ::~vector((
                                                  vector<aliyun::RamListPoliciesForRolePolicyType,_std::allocator<aliyun::RamListPoliciesForRolePolicyType>_>
                                                  *)&resp);
                                        std::__cxx11::string::~string((string *)&req);
                                        req.account_id._M_string_length = 0;
                                        req.account_id.field_2._M_allocated_capacity =
                                             req.account_id.field_2._M_allocated_capacity &
                                             0xffffffffffffff00;
                                        _resp = (pointer)0x0;
                                        req.account_id._M_dataplus._M_p = (pointer)paVar1;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&req_6,"cn-hangzhou",
                                                   (allocator<char> *)&local_258);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  (local_298,"my_appid",(allocator<char> *)&resp_6);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_278,"my_secret",&local_2b9);
                                        this = (RamUpdateUserRequestType *)
                                               aliyun::Ram::CreateRamClient
                                                         (&req_6,local_298,&local_278);
                                        std::__cxx11::string::~string((string *)&local_278);
                                        std::__cxx11::string::~string(local_298);
                                        std::__cxx11::string::~string((string *)&req_6);
                                        if (this == (RamUpdateUserRequestType *)0x0) {
                                          std::
                                          vector<aliyun::RamListPoliciesForUserPolicyType,_std::allocator<aliyun::RamListPoliciesForUserPolicyType>_>
                                          ::~vector((
                                                  vector<aliyun::RamListPoliciesForUserPolicyType,_std::allocator<aliyun::RamListPoliciesForUserPolicyType>_>
                                                  *)&resp);
                                          std::__cxx11::string::~string((string *)&req);
                                          req.account_id._M_string_length = 0;
                                          req.account_id.field_2._M_allocated_capacity =
                                               req.account_id.field_2._M_allocated_capacity &
                                               0xffffffffffffff00;
                                          _Stack_130._M_p = (pointer)0x0;
                                          local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                                          _resp = (pointer)0x0;
                                          req.account_id._M_dataplus._M_p = (pointer)paVar1;
                                          local_138._M_p = local_128;
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&req_6,"cn-hangzhou",
                                                     (allocator<char> *)&local_258);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    (local_298,"my_appid",(allocator<char> *)&resp_6
                                                    );
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_278,"my_secret",&local_2b9);
                                          this = (RamUpdateUserRequestType *)
                                                 aliyun::Ram::CreateRamClient
                                                           (&req_6,local_298,&local_278);
                                          std::__cxx11::string::~string((string *)&local_278);
                                          std::__cxx11::string::~string(local_298);
                                          std::__cxx11::string::~string((string *)&req_6);
                                          if (this == (RamUpdateUserRequestType *)0x0) {
                                            std::
                                            vector<aliyun::RamListPolicyVersionsPolicyVersionType,_std::allocator<aliyun::RamListPolicyVersionsPolicyVersionType>_>
                                            ::~vector((
                                                  vector<aliyun::RamListPolicyVersionsPolicyVersionType,_std::allocator<aliyun::RamListPolicyVersionsPolicyVersionType>_>
                                                  *)&resp);
                                            aliyun::RamListPolicyVersionsRequestType::
                                            ~RamListPolicyVersionsRequestType
                                                      ((RamListPolicyVersionsRequestType *)&req);
                                            req.account_id._M_string_length = 0;
                                            req.account_id.field_2._M_allocated_capacity =
                                                 req.account_id.field_2._M_allocated_capacity &
                                                 0xffffffffffffff00;
                                            _Stack_130._M_p = (pointer)0x0;
                                            local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
                                            req_6.user_name._M_dataplus._M_p = (pointer)0x0;
                                            req_6.user_name._M_string_length = 0;
                                            req_6.user_name.field_2._M_allocated_capacity = 0;
                                            local_1f8._M_p = local_1e8;
                                            local_1f0._M_p = (pointer)0x0;
                                            local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
                                            req.account_id._M_dataplus._M_p = (pointer)paVar1;
                                            local_138._M_p = local_128;
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      (local_298,"cn-hangzhou",
                                                       (allocator<char> *)&resp_6);
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_278,"my_appid",
                                                       (allocator<char> *)&resp);
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_258,"my_secret",&local_2b9);
                                            this = (RamUpdateUserRequestType *)
                                                   aliyun::Ram::CreateRamClient
                                                             (local_298,&local_278,&local_258);
                                            std::__cxx11::string::~string((string *)&local_258);
                                            std::__cxx11::string::~string((string *)&local_278);
                                            std::__cxx11::string::~string(local_298);
                                            if (this == (RamUpdateUserRequestType *)0x0) {
                                              aliyun::RamListRolesResponseType::
                                              ~RamListRolesResponseType
                                                        ((RamListRolesResponseType *)&req_6);
                                              aliyun::RamListRolesRequestType::
                                              ~RamListRolesRequestType
                                                        ((RamListRolesRequestType *)&req);
                                              req.account_id._M_string_length = 0;
                                              req.account_id.field_2._M_allocated_capacity =
                                                   req.account_id.field_2._M_allocated_capacity &
                                                   0xffffffffffffff00;
                                              _Stack_130._M_p = (pointer)0x0;
                                              local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00
                                              ;
                                              req_6.user_name._M_dataplus._M_p = (pointer)0x0;
                                              req_6.user_name._M_string_length = 0;
                                              req_6.user_name.field_2._M_allocated_capacity = 0;
                                              local_1f8._M_p = local_1e8;
                                              local_1f0._M_p = (pointer)0x0;
                                              local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00
                                              ;
                                              req.account_id._M_dataplus._M_p = (pointer)paVar1;
                                              local_138._M_p = local_128;
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        (local_298,"cn-hangzhou",
                                                         (allocator<char> *)&resp_6);
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_278,"my_appid",
                                                         (allocator<char> *)&resp);
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_258,"my_secret",&local_2b9
                                                        );
                                              this = (RamUpdateUserRequestType *)
                                                     aliyun::Ram::CreateRamClient
                                                               (local_298,&local_278,&local_258);
                                              std::__cxx11::string::~string((string *)&local_258);
                                              std::__cxx11::string::~string((string *)&local_278);
                                              std::__cxx11::string::~string(local_298);
                                              if (this == (RamUpdateUserRequestType *)0x0) {
                                                aliyun::RamListUsersResponseType::
                                                ~RamListUsersResponseType
                                                          ((RamListUsersResponseType *)&req_6);
                                                aliyun::RamListUsersRequestType::
                                                ~RamListUsersRequestType
                                                          ((RamListUsersRequestType *)&req);
                                                req.account_id._M_string_length = 0;
                                                req.account_id.field_2._M_allocated_capacity =
                                                     req.account_id.field_2._M_allocated_capacity &
                                                     0xffffffffffffff00;
                                                _resp = (pointer)0x0;
                                                req.account_id._M_dataplus._M_p = (pointer)paVar1;
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&req_6,"cn-hangzhou",
                                                           (allocator<char> *)&local_258);
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          (local_298,"my_appid",
                                                           (allocator<char> *)&resp_6);
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_278,"my_secret",
                                                           &local_2b9);
                                                this = (RamUpdateUserRequestType *)
                                                       aliyun::Ram::CreateRamClient
                                                                 (&req_6,local_298,&local_278);
                                                std::__cxx11::string::~string((string *)&local_278);
                                                std::__cxx11::string::~string(local_298);
                                                std::__cxx11::string::~string((string *)&req_6);
                                                if (this == (RamUpdateUserRequestType *)0x0) {
                                                  std::
                                                  vector<aliyun::RamListUsersForGroupUserType,_std::allocator<aliyun::RamListUsersForGroupUserType>_>
                                                  ::~vector((
                                                  vector<aliyun::RamListUsersForGroupUserType,_std::allocator<aliyun::RamListUsersForGroupUserType>_>
                                                  *)&resp);
                                                  std::__cxx11::string::~string((string *)&req);
                                                  _resp_6 = (pointer)0x0;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&req,"cn-hangzhou",
                                                             (allocator<char> *)&local_278);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&req_6,"my_appid",
                                                             (allocator<char> *)&local_258);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_298,"my_secret",
                                                             (allocator<char> *)&resp);
                                                  this = (RamUpdateUserRequestType *)
                                                         aliyun::Ram::CreateRamClient
                                                                   (&req,&req_6,local_298);
                                                  std::__cxx11::string::~string(local_298);
                                                  std::__cxx11::string::~string((string *)&req_6);
                                                  std::__cxx11::string::~string((string *)&req);
                                                  if (this == (RamUpdateUserRequestType *)0x0) {
                                                    std::
                                                  vector<aliyun::RamListVirtualMFADevicesVirtualMFADeviceType,_std::allocator<aliyun::RamListVirtualMFADevicesVirtualMFADeviceType>_>
                                                  ::~vector((
                                                  vector<aliyun::RamListVirtualMFADevicesVirtualMFADeviceType,_std::allocator<aliyun::RamListVirtualMFADevicesVirtualMFADeviceType>_>
                                                  *)&resp_6);
                                                  req.account_id._M_string_length = 0;
                                                  req.account_id.field_2._M_allocated_capacity =
                                                       req.account_id.field_2._M_allocated_capacity
                                                       & 0xffffffffffffff00;
                                                  _Stack_130._M_p = (pointer)0x0;
                                                  local_128._0_8_ =
                                                       local_128._0_8_ & 0xffffffffffffff00;
                                                  req.account_id._M_dataplus._M_p = (pointer)paVar1;
                                                  local_138._M_p = local_128;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&req_6,"cn-hangzhou",
                                                             (allocator<char> *)&local_258);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_298,"my_appid",
                                                             (allocator<char> *)&resp_6);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_278,"my_secret",
                                                             &local_2b9);
                                                  this = (RamUpdateUserRequestType *)
                                                         aliyun::Ram::CreateRamClient
                                                                   (&req_6,local_298,&local_278);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_278);
                                                  std::__cxx11::string::~string(local_298);
                                                  std::__cxx11::string::~string((string *)&req_6);
                                                  if (this == (RamUpdateUserRequestType *)0x0) {
                                                    aliyun::RamRemoveUserFromGroupRequestType::
                                                    ~RamRemoveUserFromGroupRequestType
                                                              ((RamRemoveUserFromGroupRequestType *)
                                                               &req);
                                                    req.account_id._M_string_length = 0;
                                                    req.account_id.field_2._M_allocated_capacity =
                                                         req.account_id.field_2.
                                                         _M_allocated_capacity & 0xffffffffffffff00;
                                                    req.account_id._M_dataplus._M_p =
                                                         (pointer)paVar1;
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&req_6,"cn-hangzhou",
                                                               (allocator<char> *)&local_258);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_298,"my_appid",
                                                               (allocator<char> *)&resp_6);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_278,"my_secret",
                                                               &local_2b9);
                                                    this = (RamUpdateUserRequestType *)
                                                           aliyun::Ram::CreateRamClient
                                                                     (&req_6,local_298,&local_278);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_278);
                                                    std::__cxx11::string::~string(local_298);
                                                    std::__cxx11::string::~string((string *)&req_6);
                                                    if (this == (RamUpdateUserRequestType *)0x0) {
                                                      std::__cxx11::string::~string((string *)&req);
                                                      req.account_id._M_string_length = 0;
                                                      req.account_id.field_2._M_allocated_capacity =
                                                           req.account_id.field_2.
                                                           _M_allocated_capacity &
                                                           0xffffffffffffff00;
                                                      _Stack_130._M_p = (pointer)0x0;
                                                      local_128._0_8_ =
                                                           local_128._0_8_ & 0xffffffffffffff00;
                                                      req.account_id._M_dataplus._M_p =
                                                           (pointer)paVar1;
                                                      local_138._M_p = local_128;
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&req_6,"cn-hangzhou",
                                                                 (allocator<char> *)&local_258);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_298,"my_appid",
                                                                 (allocator<char> *)&resp_6);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,"my_secret",
                                                                 &local_2b9);
                                                      this = (RamUpdateUserRequestType *)
                                                             aliyun::Ram::CreateRamClient
                                                                       (&req_6,local_298,&local_278)
                                                      ;
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_278);
                                                      std::__cxx11::string::~string(local_298);
                                                      std::__cxx11::string::~string
                                                                ((string *)&req_6);
                                                      if (this == (RamUpdateUserRequestType *)0x0) {
                                                        aliyun::
                                                  RamSetDefaultPolicyVersionRequestType::
                                                  ~RamSetDefaultPolicyVersionRequestType
                                                            ((RamSetDefaultPolicyVersionRequestType
                                                              *)&req);
                                                  req.account_id._M_string_length = 0;
                                                  req.account_id.field_2._M_allocated_capacity =
                                                       req.account_id.field_2._M_allocated_capacity
                                                       & 0xffffffffffffff00;
                                                  _Stack_130._M_p = (pointer)0x0;
                                                  local_128._0_8_ =
                                                       local_128._0_8_ & 0xffffffffffffff00;
                                                  local_110._M_p = (pointer)0x0;
                                                  local_108._0_8_ =
                                                       local_108._0_8_ & 0xffffffffffffff00;
                                                  local_f8 = (char  [8])&local_e8;
                                                  local_f0 = 0;
                                                  local_e8._M_local_buf[0] = '\0';
                                                  local_d8._M_p = (pointer)&local_c8;
                                                  local_d0 = 0;
                                                  local_c8._M_local_buf[0] = '\0';
                                                  req.account_id._M_dataplus._M_p = (pointer)paVar1;
                                                  local_138._M_p = local_128;
                                                  local_118 = (char  [8])local_108;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&req_6,"cn-hangzhou",
                                                             (allocator<char> *)&local_258);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_298,"my_appid",
                                                             (allocator<char> *)&resp_6);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_278,"my_secret",
                                                             &local_2b9);
                                                  this = (RamUpdateUserRequestType *)
                                                         aliyun::Ram::CreateRamClient
                                                                   (&req_6,local_298,&local_278);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_278);
                                                  std::__cxx11::string::~string(local_298);
                                                  std::__cxx11::string::~string((string *)&req_6);
                                                  if (this == (RamUpdateUserRequestType *)0x0) {
                                                    aliyun::RamSetPasswordPolicyRequestType::
                                                    ~RamSetPasswordPolicyRequestType
                                                              ((RamSetPasswordPolicyRequestType *)
                                                               &req);
                                                    req.account_id._M_string_length = 0;
                                                    req.account_id.field_2._M_allocated_capacity =
                                                         req.account_id.field_2.
                                                         _M_allocated_capacity & 0xffffffffffffff00;
                                                    req.account_id._M_dataplus._M_p =
                                                         (pointer)paVar1;
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&req_6,"cn-hangzhou",
                                                               (allocator<char> *)&local_258);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_298,"my_appid",
                                                               (allocator<char> *)&resp_6);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_278,"my_secret",
                                                               &local_2b9);
                                                    this = (RamUpdateUserRequestType *)
                                                           aliyun::Ram::CreateRamClient
                                                                     (&req_6,local_298,&local_278);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_278);
                                                    std::__cxx11::string::~string(local_298);
                                                    std::__cxx11::string::~string((string *)&req_6);
                                                    if (this == (RamUpdateUserRequestType *)0x0) {
                                                      std::__cxx11::string::~string((string *)&req);
                                                      req.account_id._M_string_length = 0;
                                                      req.account_id.field_2._M_allocated_capacity =
                                                           req.account_id.field_2.
                                                           _M_allocated_capacity &
                                                           0xffffffffffffff00;
                                                      req.account_id._M_dataplus._M_p =
                                                           (pointer)paVar1;
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&req_6,"cn-hangzhou",
                                                                 (allocator<char> *)&local_258);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                (local_298,"my_appid",
                                                                 (allocator<char> *)&resp_6);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,"my_secret",
                                                                 &local_2b9);
                                                      this = (RamUpdateUserRequestType *)
                                                             aliyun::Ram::CreateRamClient
                                                                       (&req_6,local_298,&local_278)
                                                      ;
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_278);
                                                      std::__cxx11::string::~string(local_298);
                                                      std::__cxx11::string::~string
                                                                ((string *)&req_6);
                                                      if (this == (RamUpdateUserRequestType *)0x0) {
                                                        std::__cxx11::string::~string
                                                                  ((string *)&req);
                                                        req.account_id._M_string_length = 0;
                                                        req.account_id.field_2._M_allocated_capacity
                                                             = req.account_id.field_2.
                                                               _M_allocated_capacity &
                                                               0xffffffffffffff00;
                                                        _Stack_130._M_p = (pointer)0x0;
                                                        local_128._0_8_ =
                                                             local_128._0_8_ & 0xffffffffffffff00;
                                                        local_110._M_p = (pointer)0x0;
                                                        local_108._0_8_ =
                                                             local_108._0_8_ & 0xffffffffffffff00;
                                                        req.account_id._M_dataplus._M_p =
                                                             (pointer)paVar1;
                                                        local_138._M_p = local_128;
                                                        local_118 = (char  [8])local_108;
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  ((string *)&req_6,"cn-hangzhou",
                                                                   (allocator<char> *)&local_258);
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  (local_298,"my_appid",
                                                                   (allocator<char> *)&resp_6);
                                                        std::__cxx11::string::
                                                        string<std::allocator<char>>
                                                                  ((string *)&local_278,"my_secret",
                                                                   &local_2b9);
                                                        this = (RamUpdateUserRequestType *)
                                                               aliyun::Ram::CreateRamClient
                                                                         (&req_6,local_298,
                                                                          &local_278);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&local_278);
                                                        std::__cxx11::string::~string(local_298);
                                                        std::__cxx11::string::~string
                                                                  ((string *)&req_6);
                                                        if (this == (RamUpdateUserRequestType *)0x0)
                                                        {
                                                          aliyun::RamUpdateAccessKeyRequestType::
                                                          ~RamUpdateAccessKeyRequestType
                                                                    ((RamUpdateAccessKeyRequestType
                                                                      *)&req);
                                                          req_6.user_name._M_string_length = 0;
                                                          req_6.user_name.field_2.
                                                          _M_allocated_capacity =
                                                               req_6.user_name.field_2.
                                                               _M_allocated_capacity &
                                                               0xffffffffffffff00;
                                                          local_1f8._M_p = local_1e8;
                                                          local_1f0._M_p = (pointer)0x0;
                                                          local_1e8._0_8_ =
                                                               local_1e8._0_8_ & 0xffffffffffffff00;
                                                          local_1d8 = (char  [8])&local_1c8;
                                                          local_1d0._M_p = (pointer)0x0;
                                                          req.account_id._M_string_length = 0;
                                                          req.account_id.field_2.
                                                          _M_allocated_capacity =
                                                               req.account_id.field_2.
                                                               _M_allocated_capacity &
                                                               0xffffffffffffff00;
                                                          _Stack_130._M_p = (pointer)0x0;
                                                          local_128._0_8_ =
                                                               local_128._0_8_ & 0xffffffffffffff00;
                                                          local_110._M_p = (pointer)0x0;
                                                          local_1c8._M_local_buf[0] = '\0';
                                                          local_108._0_8_ =
                                                               local_108._0_8_ & 0xffffffffffffff00;
                                                          local_f8 = (char  [8])&local_e8;
                                                          local_f0 = 0;
                                                          local_e8._M_local_buf[0] = '\0';
                                                          req_6.user_name._M_dataplus._M_p =
                                                               (pointer)paVar2;
                                                          req.account_id._M_dataplus._M_p =
                                                               (pointer)paVar1;
                                                          local_138._M_p = local_128;
                                                          local_118 = (char  [8])local_108;
                                                          std::__cxx11::string::
                                                          string<std::allocator<char>>
                                                                    (local_298,"cn-hangzhou",
                                                                     (allocator<char> *)&resp_6);
                                                          std::__cxx11::string::
                                                          string<std::allocator<char>>
                                                                    ((string *)&local_278,"my_appid"
                                                                     ,(allocator<char> *)&resp);
                                                          std::__cxx11::string::
                                                          string<std::allocator<char>>
                                                                    ((string *)&local_258,
                                                                     "my_secret",&local_2b9);
                                                          this = (RamUpdateUserRequestType *)
                                                                 aliyun::Ram::CreateRamClient
                                                                           (local_298,&local_278,
                                                                            &local_258);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&local_258);
                                                          std::__cxx11::string::~string
                                                                    ((string *)&local_278);
                                                          std::__cxx11::string::~string(local_298);
                                                          if (this == (RamUpdateUserRequestType *)
                                                                      0x0) {
                                                            aliyun::RamUpdateGroupGroupType::
                                                            ~RamUpdateGroupGroupType
                                                                      ((RamUpdateGroupGroupType *)
                                                                       &req);
                                                            aliyun::RamUpdateGroupRequestType::
                                                            ~RamUpdateGroupRequestType
                                                                      ((RamUpdateGroupRequestType *)
                                                                       &req_6);
                                                            req.account_id._M_string_length = 0;
                                                            req.account_id.field_2.
                                                            _M_allocated_capacity =
                                                                 req.account_id.field_2.
                                                                 _M_allocated_capacity &
                                                                 0xffffffffffffff00;
                                                            _Stack_130._M_p = (pointer)0x0;
                                                            local_128._0_8_ =
                                                                 local_128._0_8_ &
                                                                 0xffffffffffffff00;
                                                            local_110._M_p = (pointer)0x0;
                                                            local_108._0_8_ =
                                                                 local_108._0_8_ &
                                                                 0xffffffffffffff00;
                                                            local_f8 = (char  [8])&local_e8;
                                                            local_f0 = 0;
                                                            local_e8._M_local_buf[0] = '\0';
                                                            req.account_id._M_dataplus._M_p =
                                                                 (pointer)paVar1;
                                                            local_138._M_p = local_128;
                                                            local_118 = (char  [8])local_108;
                                                            std::__cxx11::string::
                                                            string<std::allocator<char>>
                                                                      ((string *)&req_6,
                                                                       "cn-hangzhou",
                                                                       (allocator<char> *)&local_258
                                                                      );
                                                            std::__cxx11::string::
                                                            string<std::allocator<char>>
                                                                      (local_298,"my_appid",
                                                                       (allocator<char> *)&resp_6);
                                                            std::__cxx11::string::
                                                            string<std::allocator<char>>
                                                                      ((string *)&local_278,
                                                                       "my_secret",&local_2b9);
                                                            this = (RamUpdateUserRequestType *)
                                                                   aliyun::Ram::CreateRamClient
                                                                             (&req_6,local_298,
                                                                              &local_278);
                                                            std::__cxx11::string::~string
                                                                      ((string *)&local_278);
                                                            std::__cxx11::string::~string(local_298)
                                                            ;
                                                            std::__cxx11::string::~string
                                                                      ((string *)&req_6);
                                                            if (this == (RamUpdateUserRequestType *)
                                                                        0x0) {
                                                              aliyun::
                                                  RamUpdateLoginProfileRequestType::
                                                  ~RamUpdateLoginProfileRequestType
                                                            ((RamUpdateLoginProfileRequestType *)
                                                             &req);
                                                  req_6.user_name._M_string_length = 0;
                                                  req_6.user_name.field_2._M_allocated_capacity =
                                                       req_6.user_name.field_2._M_allocated_capacity
                                                       & 0xffffffffffffff00;
                                                  local_1f8._M_p = local_1e8;
                                                  local_1f0._M_p = (pointer)0x0;
                                                  req.account_id._M_string_length = 0;
                                                  req.account_id.field_2._M_allocated_capacity =
                                                       req.account_id.field_2._M_allocated_capacity
                                                       & 0xffffffffffffff00;
                                                  _Stack_130._M_p = (pointer)0x0;
                                                  local_128._0_8_ =
                                                       local_128._0_8_ & 0xffffffffffffff00;
                                                  local_110._M_p = (pointer)0x0;
                                                  local_108._0_8_ =
                                                       local_108._0_8_ & 0xffffffffffffff00;
                                                  local_f8 = (char  [8])&local_e8;
                                                  local_f0 = 0;
                                                  local_e8._M_local_buf[0] = '\0';
                                                  local_d8._M_p = (pointer)&local_c8;
                                                  local_d0 = 0;
                                                  local_c8._M_local_buf[0] = '\0';
                                                  local_b8._M_p = (pointer)&local_a8;
                                                  local_b0 = 0;
                                                  local_1e8._0_8_ =
                                                       local_1e8._0_8_ & 0xffffffffffffff00;
                                                  local_a8._M_local_buf[0] = '\0';
                                                  local_98._M_p = (pointer)&local_88;
                                                  local_90 = 0;
                                                  local_88._M_local_buf[0] = '\0';
                                                  req_6.user_name._M_dataplus._M_p = (pointer)paVar2
                                                  ;
                                                  req.account_id._M_dataplus._M_p = (pointer)paVar1;
                                                  local_138._M_p = local_128;
                                                  local_118 = (char  [8])local_108;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_298,"cn-hangzhou",
                                                             (allocator<char> *)&resp_6);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_278,"my_appid",
                                                             (allocator<char> *)&resp);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_258,"my_secret",
                                                             &local_2b9);
                                                  this = (RamUpdateUserRequestType *)
                                                         aliyun::Ram::CreateRamClient
                                                                   (local_298,&local_278,&local_258)
                                                  ;
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_258);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_278);
                                                  std::__cxx11::string::~string(local_298);
                                                  if (this == (RamUpdateUserRequestType *)0x0) {
                                                    aliyun::RamUpdateRoleRoleType::
                                                    ~RamUpdateRoleRoleType
                                                              ((RamUpdateRoleRoleType *)&req);
                                                    aliyun::RamUpdateRoleRequestType::
                                                    ~RamUpdateRoleRequestType
                                                              ((RamUpdateRoleRequestType *)&req_6);
                                                    req_6.user_name._M_string_length = 0;
                                                    req_6.user_name.field_2._M_allocated_capacity =
                                                         req_6.user_name.field_2.
                                                         _M_allocated_capacity & 0xffffffffffffff00;
                                                    local_1f8._M_p = local_1e8;
                                                    local_1f0._M_p = (pointer)0x0;
                                                    local_1e8._0_8_ =
                                                         local_1e8._0_8_ & 0xffffffffffffff00;
                                                    local_1d8 = (char  [8])&local_1c8;
                                                    local_1d0._M_p = (pointer)0x0;
                                                    local_1c8._M_local_buf[0] = '\0';
                                                    local_1b8 = (char  [8])&local_1a8;
                                                    local_1b0 = 0;
                                                    local_1a8._M_local_buf[0] = '\0';
                                                    local_198._M_p = (pointer)&local_188;
                                                    local_190 = 0;
                                                    local_188._M_local_buf[0] = '\0';
                                                    local_178._M_p = (pointer)&local_168;
                                                    local_170 = 0;
                                                    req.account_id._M_string_length = 0;
                                                    req.account_id.field_2._M_allocated_capacity =
                                                         req.account_id.field_2.
                                                         _M_allocated_capacity & 0xffffffffffffff00;
                                                    _Stack_130._M_p = (pointer)0x0;
                                                    local_128._0_8_ =
                                                         local_128._0_8_ & 0xffffffffffffff00;
                                                    local_110._M_p = (pointer)0x0;
                                                    local_108._0_8_ =
                                                         local_108._0_8_ & 0xffffffffffffff00;
                                                    local_f8 = (char  [8])&local_e8;
                                                    local_f0 = 0;
                                                    local_e8._M_local_buf[0] = '\0';
                                                    local_d8._M_p = (pointer)&local_c8;
                                                    local_d0 = 0;
                                                    local_c8._M_local_buf[0] = '\0';
                                                    local_b8._M_p = (pointer)&local_a8;
                                                    local_b0 = 0;
                                                    local_a8._M_local_buf[0] = '\0';
                                                    local_98._M_p = (pointer)&local_88;
                                                    local_90 = 0;
                                                    local_168._M_local_buf[0] = '\0';
                                                    local_88._M_local_buf[0] = '\0';
                                                    local_78._M_p = (pointer)&local_68;
                                                    local_70 = 0;
                                                    local_68._M_local_buf[0] = '\0';
                                                    req_6.user_name._M_dataplus._M_p =
                                                         (pointer)paVar2;
                                                    req.account_id._M_dataplus._M_p =
                                                         (pointer)paVar1;
                                                    local_138._M_p = local_128;
                                                    local_118 = (char  [8])local_108;
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              (local_298,"cn-hangzhou",
                                                               (allocator<char> *)&resp_6);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_278,"my_appid",
                                                               (allocator<char> *)&resp);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_258,"my_secret",
                                                               &local_2b9);
                                                    this = (RamUpdateUserRequestType *)
                                                           aliyun::Ram::CreateRamClient
                                                                     (local_298,&local_278,
                                                                      &local_258);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_258);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_278);
                                                    std::__cxx11::string::~string(local_298);
                                                    if (this == (RamUpdateUserRequestType *)0x0) {
                                                      aliyun::RamUpdateUserUserType::
                                                      ~RamUpdateUserUserType
                                                                ((RamUpdateUserUserType *)&req);
                                                      aliyun::RamUpdateUserRequestType::
                                                      ~RamUpdateUserRequestType
                                                                ((RamUpdateUserRequestType *)&req_6)
                                                      ;
                                                      return 0;
                                                    }
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&resp_6,"127.0.0.1:12234",
                                                               (allocator<char> *)&resp);
                                                    aliyun::Ram::SetProxyHost
                                                              ((Ram *)this,(string *)&resp_6);
                                                    std::__cxx11::string::~string((string *)&resp_6)
                                                    ;
                                                    if ((char)(this->new_user_name)._M_string_length
                                                        == '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->new_user_name).
                                                               _M_string_length + 1) = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&resp,
                                                                                                                              
                                                  "{  \"User\": {    \"UserId\": \"UserId\",    \"UserName\": \"UserName\",    \"DisplayName\": \"DisplayName\",    \"MobilePhone\": \"MobilePhone\",    \"Email\": \"Email\",    \"Comments\": \"Comments\",    \"CreateDate\": \"CreateDate\",    \"UpdateDate\": \"UpdateDate\"  }}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,(string *)&resp);
                                                  std::__cxx11::string::~string((string *)&resp);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req_6);
                                                  std::__cxx11::string::assign((char *)&local_1f8);
                                                  std::__cxx11::string::assign(local_1d8);
                                                  std::__cxx11::string::assign(local_1b8);
                                                  std::__cxx11::string::assign((char *)&local_198);
                                                  std::__cxx11::string::assign((char *)&local_178);
                                                  aliyun::Ram::UpdateUser
                                                            (this,(RamUpdateUserResponseType *)
                                                                  &req_6,(RamErrorInfo *)&req);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&resp_6,"127.0.0.1:12234",
                                                               (allocator<char> *)&resp);
                                                    aliyun::Ram::SetProxyHost
                                                              ((Ram *)this,(string *)&resp_6);
                                                    std::__cxx11::string::~string((string *)&resp_6)
                                                    ;
                                                    if ((char)(this->new_user_name)._M_string_length
                                                        == '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->new_user_name).
                                                               _M_string_length + 1) = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&resp,
                                                                                                                              
                                                  "{  \"Role\": {    \"RoleId\": \"RoleId\",    \"RoleName\": \"RoleName\",    \"Arn\": \"Arn\",    \"Description\": \"Description\",    \"AssumeRolePolicyDocument\": \"AssumeRolePolicyDocument\",    \"CreateDate\": \"CreateDate\",    \"UpdateDate\": \"UpdateDate\"  }}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,(string *)&resp);
                                                  std::__cxx11::string::~string((string *)&resp);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req_6);
                                                  std::__cxx11::string::assign((char *)&local_1f8);
                                                  aliyun::Ram::UpdateRole
                                                            ((RamUpdateRoleRequestType *)this,
                                                             (RamUpdateRoleResponseType *)&req_6,
                                                             (RamErrorInfo *)&req);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_258,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&resp_6);
                                                    aliyun::Ram::SetProxyHost
                                                              ((Ram *)this,&local_258);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_258);
                                                    if ((char)(this->new_user_name)._M_string_length
                                                        == '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->new_user_name).
                                                               _M_string_length + 1) = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&resp_6,"{}",&local_2b9);
                                                    HttpTestListener::SetResponseBody
                                                              (this_00,(string *)&resp_6);
                                                    std::__cxx11::string::~string((string *)&resp_6)
                                                    ;
                                                    HttpTestListener::Start(this_00);
                                                    std::__cxx11::string::assign((char *)&req);
                                                    std::__cxx11::string::assign((char *)&local_138)
                                                    ;
                                                    std::__cxx11::string::assign(local_118);
                                                    std::__cxx11::string::assign(local_f8);
                                                    aliyun::Ram::UpdateLoginProfile
                                                              ((RamUpdateLoginProfileRequestType *)
                                                               this,(
                                                  RamUpdateLoginProfileResponseType *)&req,
                                                  (RamErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&resp_6,"127.0.0.1:12234",
                                                               (allocator<char> *)&resp);
                                                    aliyun::Ram::SetProxyHost
                                                              ((Ram *)this,(string *)&resp_6);
                                                    std::__cxx11::string::~string((string *)&resp_6)
                                                    ;
                                                    if ((char)(this->new_user_name)._M_string_length
                                                        == '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->new_user_name).
                                                               _M_string_length + 1) = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&resp,
                                                                                                                              
                                                  "{  \"Group\": {    \"GroupName\": \"GroupName\",    \"Comments\": \"Comments\",    \"CreateDate\": \"CreateDate\",    \"UpdateDate\": \"UpdateDate\"  }}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,(string *)&resp);
                                                  std::__cxx11::string::~string((string *)&resp);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req_6);
                                                  std::__cxx11::string::assign((char *)&local_1f8);
                                                  std::__cxx11::string::assign(local_1d8);
                                                  aliyun::Ram::UpdateGroup
                                                            ((RamUpdateGroupRequestType *)this,
                                                             (RamUpdateGroupResponseType *)&req_6,
                                                             (RamErrorInfo *)&req);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_258,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&resp_6);
                                                    aliyun::Ram::SetProxyHost
                                                              ((Ram *)this,&local_258);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_258);
                                                    if ((char)(this->new_user_name)._M_string_length
                                                        == '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->new_user_name).
                                                               _M_string_length + 1) = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&resp_6,"{}",&local_2b9);
                                                    HttpTestListener::SetResponseBody
                                                              (this_00,(string *)&resp_6);
                                                    std::__cxx11::string::~string((string *)&resp_6)
                                                    ;
                                                    HttpTestListener::Start(this_00);
                                                    std::__cxx11::string::assign((char *)&req);
                                                    std::__cxx11::string::assign((char *)&local_138)
                                                    ;
                                                    std::__cxx11::string::assign(local_118);
                                                    aliyun::Ram::UpdateAccessKey
                                                              ((RamUpdateAccessKeyRequestType *)this
                                                               ,(RamUpdateAccessKeyResponseType *)
                                                                &req,(RamErrorInfo *)&resp);
                                                    HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_258,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&resp_6);
                                                    aliyun::Ram::SetProxyHost
                                                              ((Ram *)this,&local_258);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_258);
                                                    if ((char)(this->new_user_name)._M_string_length
                                                        == '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->new_user_name).
                                                               _M_string_length + 1) = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&resp_6,"{}",&local_2b9);
                                                    HttpTestListener::SetResponseBody
                                                              (this_00,(string *)&resp_6);
                                                    std::__cxx11::string::~string((string *)&resp_6)
                                                    ;
                                                    HttpTestListener::Start(this_00);
                                                    std::__cxx11::string::assign((char *)&req);
                                                    aliyun::Ram::UnbindMFADevice
                                                              ((RamUnbindMFADeviceRequestType *)this
                                                               ,(RamUnbindMFADeviceResponseType *)
                                                                &req,(RamErrorInfo *)&resp);
                                                    HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_258,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&resp_6);
                                                    aliyun::Ram::SetProxyHost
                                                              ((Ram *)this,&local_258);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_258);
                                                    if ((char)(this->new_user_name)._M_string_length
                                                        == '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->new_user_name).
                                                               _M_string_length + 1) = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&resp_6,
                                                                                                                              
                                                  "{  \"SecurityPreference\": {    \"LoginProfilePreference\": {      \"EnableSaveMFATicket\": true    }  }}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,(string *)&resp_6);
                                                  std::__cxx11::string::~string((string *)&resp_6);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  aliyun::Ram::SetSecurityPreference
                                                            ((RamSetSecurityPreferenceRequestType *)
                                                             this,(
                                                  RamSetSecurityPreferenceResponseType *)&req,
                                                  (RamErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_258,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&resp_6);
                                                    aliyun::Ram::SetProxyHost
                                                              ((Ram *)this,&local_258);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_258);
                                                    if ((char)(this->new_user_name)._M_string_length
                                                        == '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->new_user_name).
                                                               _M_string_length + 1) = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&resp_6,
                                                                                                                              
                                                  "{  \"PasswordPolicy\": {    \"MinimumPasswordLength\": 0,    \"RequireLowercaseCharacters\": true,    \"RequireUppercaseCharacters\": true,    \"RequireNumbers\": true,    \"RequireSymbols\": true  }}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,(string *)&resp_6);
                                                  std::__cxx11::string::~string((string *)&resp_6);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  std::__cxx11::string::assign((char *)&local_138);
                                                  std::__cxx11::string::assign(local_118);
                                                  std::__cxx11::string::assign(local_f8);
                                                  std::__cxx11::string::assign((char *)&local_d8);
                                                  aliyun::Ram::SetPasswordPolicy
                                                            ((RamSetPasswordPolicyRequestType *)this
                                                             ,(RamSetPasswordPolicyResponseType *)
                                                              &req,(RamErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_258,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&resp_6);
                                                    aliyun::Ram::SetProxyHost
                                                              ((Ram *)this,&local_258);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_258);
                                                    if ((char)(this->new_user_name)._M_string_length
                                                        == '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->new_user_name).
                                                               _M_string_length + 1) = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&resp_6,"{}",&local_2b9);
                                                    HttpTestListener::SetResponseBody
                                                              (this_00,(string *)&resp_6);
                                                    std::__cxx11::string::~string((string *)&resp_6)
                                                    ;
                                                    HttpTestListener::Start(this_00);
                                                    std::__cxx11::string::assign((char *)&req);
                                                    std::__cxx11::string::assign((char *)&local_138)
                                                    ;
                                                    aliyun::Ram::SetDefaultPolicyVersion
                                                              ((
                                                  RamSetDefaultPolicyVersionRequestType *)this,
                                                  (RamSetDefaultPolicyVersionResponseType *)&req,
                                                  (RamErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_258,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&resp_6);
                                                    aliyun::Ram::SetProxyHost
                                                              ((Ram *)this,&local_258);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_258);
                                                    if ((char)(this->new_user_name)._M_string_length
                                                        == '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->new_user_name).
                                                               _M_string_length + 1) = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&resp_6,"{}",&local_2b9);
                                                    HttpTestListener::SetResponseBody
                                                              (this_00,(string *)&resp_6);
                                                    std::__cxx11::string::~string((string *)&resp_6)
                                                    ;
                                                    HttpTestListener::Start(this_00);
                                                    std::__cxx11::string::assign((char *)&req);
                                                    aliyun::Ram::SetAccountAlias
                                                              ((RamSetAccountAliasRequestType *)this
                                                               ,(RamSetAccountAliasResponseType *)
                                                                &req,(RamErrorInfo *)&resp);
                                                    HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_258,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&resp_6);
                                                    aliyun::Ram::SetProxyHost
                                                              ((Ram *)this,&local_258);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_258);
                                                    if ((char)(this->new_user_name)._M_string_length
                                                        == '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->new_user_name).
                                                               _M_string_length + 1) = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&resp_6,"{}",&local_2b9);
                                                    HttpTestListener::SetResponseBody
                                                              (this_00,(string *)&resp_6);
                                                    std::__cxx11::string::~string((string *)&resp_6)
                                                    ;
                                                    HttpTestListener::Start(this_00);
                                                    std::__cxx11::string::assign((char *)&req);
                                                    std::__cxx11::string::assign((char *)&local_138)
                                                    ;
                                                    aliyun::Ram::RemoveUserFromGroup
                                                              ((RamRemoveUserFromGroupRequestType *)
                                                               this,(
                                                  RamRemoveUserFromGroupResponseType *)&req,
                                                  (RamErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_278,
                                                               "127.0.0.1:12234",
                                                               (allocator<char> *)&local_258);
                                                    aliyun::Ram::SetProxyHost
                                                              ((Ram *)this,&local_278);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_278);
                                                    if ((char)(this->new_user_name)._M_string_length
                                                        == '\x01') {
                                                      *(undefined1 *)
                                                       ((long)&(this->new_user_name).
                                                               _M_string_length + 1) = 0;
                                                    }
                                                    this_00 = (HttpTestListener *)
                                                              operator_new(0x180);
                                                    HttpTestListener::HttpTestListener
                                                              (this_00,0x2fca);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_258,
                                                                                                                              
                                                  "{  \"VirtualMFADevices\": {    \"VirtualMFADevice\": [      {        \"User\": {          \"UserId\": \"UserId\",          \"UserName\": \"UserName\",          \"DisplayName\": \"DisplayName\"        },        \"SerialNumber\": \"SerialNumber\",        \"ActivateDate\": \"ActivateDate\"      }    ]  }}"
                                                  ,(allocator<char> *)&resp);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,&local_258);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_258);
                                                  HttpTestListener::Start(this_00);
                                                  aliyun::Ram::ListVirtualMFADevices
                                                            ((RamListVirtualMFADevicesResponseType *
                                                             )this,(RamErrorInfo *)&resp_6);
                                                  HttpTestListener::WaitComplete(this_00);
                                                  }
                                                }
                                                else {
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_258,"127.0.0.1:12234",
                                                             (allocator<char> *)&resp_6);
                                                  aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_258);
                                                  if ((char)(this->new_user_name)._M_string_length
                                                      == '\x01') {
                                                    *(undefined1 *)
                                                     ((long)&(this->new_user_name)._M_string_length
                                                     + 1) = 0;
                                                  }
                                                  this_00 = (HttpTestListener *)operator_new(0x180);
                                                  HttpTestListener::HttpTestListener(this_00,0x2fca)
                                                  ;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&resp_6,
                                                                                                                          
                                                  "{  \"Users\": {    \"User\": [      {        \"UserName\": \"UserName\",        \"DisplayName\": \"DisplayName\",        \"JoinDate\": \"JoinDate\"      }    ]  }}"
                                                  ,&local_2b9);
                                                  HttpTestListener::SetResponseBody
                                                            (this_00,(string *)&resp_6);
                                                  std::__cxx11::string::~string((string *)&resp_6);
                                                  HttpTestListener::Start(this_00);
                                                  std::__cxx11::string::assign((char *)&req);
                                                  aliyun::Ram::ListUsersForGroup
                                                            ((RamListUsersForGroupRequestType *)this
                                                             ,(RamListUsersForGroupResponseType *)
                                                              &req,(RamErrorInfo *)&resp);
                                                  HttpTestListener::WaitComplete(this_00);
                                                }
                                              }
                                              else {
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&resp_6,"127.0.0.1:12234",
                                                           (allocator<char> *)&resp);
                                                aliyun::Ram::SetProxyHost
                                                          ((Ram *)this,(string *)&resp_6);
                                                std::__cxx11::string::~string((string *)&resp_6);
                                                if ((char)(this->new_user_name)._M_string_length ==
                                                    '\x01') {
                                                  *(undefined1 *)
                                                   ((long)&(this->new_user_name)._M_string_length +
                                                   1) = 0;
                                                }
                                                this_00 = (HttpTestListener *)operator_new(0x180);
                                                HttpTestListener::HttpTestListener(this_00,0x2fca);
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&resp,
                                                                                                                      
                                                  "{  \"Users\": {    \"User\": [      {        \"UserId\": \"UserId\",        \"UserName\": \"UserName\",        \"DisplayName\": \"DisplayName\",        \"MobilePhone\": \"MobilePhone\",        \"Email\": \"Email\",        \"Comments\": \"Comments\",        \"CreateDate\": \"CreateDate\",        \"UpdateDate\": \"UpdateDate\"      }    ]  },  \"IsTruncated\": true,  \"Marker\": \"Marker\"}"
                                                  ,&local_2b9);
                                                HttpTestListener::SetResponseBody
                                                          (this_00,(string *)&resp);
                                                std::__cxx11::string::~string((string *)&resp);
                                                HttpTestListener::Start(this_00);
                                                std::__cxx11::string::assign((char *)&req);
                                                std::__cxx11::string::assign((char *)&local_138);
                                                aliyun::Ram::ListUsers
                                                          ((RamListUsersRequestType *)this,
                                                           (RamListUsersResponseType *)&req,
                                                           (RamErrorInfo *)&req_6);
                                                HttpTestListener::WaitComplete(this_00);
                                              }
                                            }
                                            else {
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&resp_6,"127.0.0.1:12234",
                                                         (allocator<char> *)&resp);
                                              aliyun::Ram::SetProxyHost
                                                        ((Ram *)this,(string *)&resp_6);
                                              std::__cxx11::string::~string((string *)&resp_6);
                                              if ((char)(this->new_user_name)._M_string_length ==
                                                  '\x01') {
                                                *(undefined1 *)
                                                 ((long)&(this->new_user_name)._M_string_length + 1)
                                                     = 0;
                                              }
                                              this_00 = (HttpTestListener *)operator_new(0x180);
                                              HttpTestListener::HttpTestListener(this_00,0x2fca);
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&resp,
                                                                                                                  
                                                  "{  \"Roles\": {    \"Role\": [      {        \"RoleId\": \"RoleId\",        \"RoleName\": \"RoleName\",        \"Arn\": \"Arn\",        \"Description\": \"Description\",        \"CreateDate\": \"CreateDate\",        \"UpdateDate\": \"UpdateDate\"      }    ]  },  \"IsTruncated\": true,  \"Marker\": \"Marker\"}"
                                                  ,&local_2b9);
                                              HttpTestListener::SetResponseBody
                                                        (this_00,(string *)&resp);
                                              std::__cxx11::string::~string((string *)&resp);
                                              HttpTestListener::Start(this_00);
                                              std::__cxx11::string::assign((char *)&req);
                                              std::__cxx11::string::assign((char *)&local_138);
                                              aliyun::Ram::ListRoles
                                                        ((RamListRolesRequestType *)this,
                                                         (RamListRolesResponseType *)&req,
                                                         (RamErrorInfo *)&req_6);
                                              HttpTestListener::WaitComplete(this_00);
                                            }
                                          }
                                          else {
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_258,"127.0.0.1:12234",
                                                       (allocator<char> *)&resp_6);
                                            aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                                            std::__cxx11::string::~string((string *)&local_258);
                                            if ((char)(this->new_user_name)._M_string_length ==
                                                '\x01') {
                                              *(undefined1 *)
                                               ((long)&(this->new_user_name)._M_string_length + 1) =
                                                   0;
                                            }
                                            this_00 = (HttpTestListener *)operator_new(0x180);
                                            HttpTestListener::HttpTestListener(this_00,0x2fca);
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&resp_6,
                                                                                                              
                                                  "{  \"PolicyVersions\": {    \"PolicyVersion\": [      {        \"VersionId\": \"VersionId\",        \"IsDefaultVersion\": true,        \"PolicyDocument\": \"PolicyDocument\",        \"CreateDate\": \"CreateDate\"      }    ]  }}"
                                                  ,&local_2b9);
                                            HttpTestListener::SetResponseBody
                                                      (this_00,(string *)&resp_6);
                                            std::__cxx11::string::~string((string *)&resp_6);
                                            HttpTestListener::Start(this_00);
                                            std::__cxx11::string::assign((char *)&req);
                                            std::__cxx11::string::assign((char *)&local_138);
                                            aliyun::Ram::ListPolicyVersions
                                                      ((RamListPolicyVersionsRequestType *)this,
                                                       (RamListPolicyVersionsResponseType *)&req,
                                                       (RamErrorInfo *)&resp);
                                            HttpTestListener::WaitComplete(this_00);
                                          }
                                        }
                                        else {
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_258,"127.0.0.1:12234",
                                                     (allocator<char> *)&resp_6);
                                          aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                                          std::__cxx11::string::~string((string *)&local_258);
                                          if ((char)(this->new_user_name)._M_string_length == '\x01'
                                             ) {
                                            *(undefined1 *)
                                             ((long)&(this->new_user_name)._M_string_length + 1) = 0
                                            ;
                                          }
                                          this_00 = (HttpTestListener *)operator_new(0x180);
                                          HttpTestListener::HttpTestListener(this_00,0x2fca);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&resp_6,
                                                                                                          
                                                  "{  \"Policies\": {    \"Policy\": [      {        \"PolicyName\": \"PolicyName\",        \"PolicyType\": \"PolicyType\",        \"Description\": \"Description\",        \"DefaultVersion\": \"DefaultVersion\",        \"AttachDate\": \"AttachDate\"      }    ]  }}"
                                                  ,&local_2b9);
                                          HttpTestListener::SetResponseBody
                                                    (this_00,(string *)&resp_6);
                                          std::__cxx11::string::~string((string *)&resp_6);
                                          HttpTestListener::Start(this_00);
                                          std::__cxx11::string::assign((char *)&req);
                                          aliyun::Ram::ListPoliciesForUser
                                                    ((RamListPoliciesForUserRequestType *)this,
                                                     (RamListPoliciesForUserResponseType *)&req,
                                                     (RamErrorInfo *)&resp);
                                          HttpTestListener::WaitComplete(this_00);
                                        }
                                      }
                                      else {
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_258,"127.0.0.1:12234",
                                                   (allocator<char> *)&resp_6);
                                        aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                                        std::__cxx11::string::~string((string *)&local_258);
                                        if ((char)(this->new_user_name)._M_string_length == '\x01')
                                        {
                                          *(undefined1 *)
                                           ((long)&(this->new_user_name)._M_string_length + 1) = 0;
                                        }
                                        this_00 = (HttpTestListener *)operator_new(0x180);
                                        HttpTestListener::HttpTestListener(this_00,0x2fca);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&resp_6,
                                                                                                      
                                                  "{  \"Policies\": {    \"Policy\": [      {        \"PolicyName\": \"PolicyName\",        \"PolicyType\": \"PolicyType\",        \"Description\": \"Description\",        \"DefaultVersion\": \"DefaultVersion\",        \"AttachDate\": \"AttachDate\"      }    ]  }}"
                                                  ,&local_2b9);
                                        HttpTestListener::SetResponseBody(this_00,(string *)&resp_6)
                                        ;
                                        std::__cxx11::string::~string((string *)&resp_6);
                                        HttpTestListener::Start(this_00);
                                        std::__cxx11::string::assign((char *)&req);
                                        aliyun::Ram::ListPoliciesForRole
                                                  ((RamListPoliciesForRoleRequestType *)this,
                                                   (RamListPoliciesForRoleResponseType *)&req,
                                                   (RamErrorInfo *)&resp);
                                        HttpTestListener::WaitComplete(this_00);
                                      }
                                    }
                                    else {
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_258,"127.0.0.1:12234",
                                                 (allocator<char> *)&resp_6);
                                      aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                                      std::__cxx11::string::~string((string *)&local_258);
                                      if ((char)(this->new_user_name)._M_string_length == '\x01') {
                                        *(undefined1 *)
                                         ((long)&(this->new_user_name)._M_string_length + 1) = 0;
                                      }
                                      this_00 = (HttpTestListener *)operator_new(0x180);
                                      HttpTestListener::HttpTestListener(this_00,0x2fca);
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&resp_6,
                                                 "{  \"Policies\": {    \"Policy\": [      {        \"PolicyName\": \"PolicyName\",        \"PolicyType\": \"PolicyType\",        \"Description\": \"Description\",        \"DefaultVersion\": \"DefaultVersion\",        \"AttachDate\": \"AttachDate\"      }    ]  }}"
                                                 ,&local_2b9);
                                      HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                                      std::__cxx11::string::~string((string *)&resp_6);
                                      HttpTestListener::Start(this_00);
                                      std::__cxx11::string::assign((char *)&req);
                                      aliyun::Ram::ListPoliciesForGroup
                                                ((RamListPoliciesForGroupRequestType *)this,
                                                 (RamListPoliciesForGroupResponseType *)&req,
                                                 (RamErrorInfo *)&resp);
                                      HttpTestListener::WaitComplete(this_00);
                                    }
                                  }
                                  else {
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&resp_6,"127.0.0.1:12234",
                                               (allocator<char> *)&resp);
                                    aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                                    std::__cxx11::string::~string((string *)&resp_6);
                                    if ((char)(this->new_user_name)._M_string_length == '\x01') {
                                      *(undefined1 *)
                                       ((long)&(this->new_user_name)._M_string_length + 1) = 0;
                                    }
                                    this_00 = (HttpTestListener *)operator_new(0x180);
                                    HttpTestListener::HttpTestListener(this_00,0x2fca);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&resp,
                                               "{  \"Policies\": {    \"Policy\": [      {        \"PolicyName\": \"PolicyName\",        \"PolicyType\": \"PolicyType\",        \"Description\": \"Description\",        \"DefaultVersion\": \"DefaultVersion\",        \"CreateDate\": \"CreateDate\",        \"UpdateDate\": \"UpdateDate\",        \"AttachmentCount\": 0      }    ]  },  \"IsTruncated\": true,  \"Marker\": \"Marker\"}"
                                               ,&local_2b9);
                                    HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                                    std::__cxx11::string::~string((string *)&resp);
                                    HttpTestListener::Start(this_00);
                                    std::__cxx11::string::assign((char *)&req);
                                    std::__cxx11::string::assign((char *)&local_138);
                                    std::__cxx11::string::assign(local_118);
                                    aliyun::Ram::ListPolicies
                                              ((RamListPoliciesRequestType *)this,
                                               (RamListPoliciesResponseType *)&req,
                                               (RamErrorInfo *)&req_6);
                                    HttpTestListener::WaitComplete(this_00);
                                  }
                                }
                                else {
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_258,"127.0.0.1:12234",
                                             (allocator<char> *)&resp_6);
                                  aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                                  std::__cxx11::string::~string((string *)&local_258);
                                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                                    *(undefined1 *)
                                     ((long)&(this->new_user_name)._M_string_length + 1) = 0;
                                  }
                                  this_00 = (HttpTestListener *)operator_new(0x180);
                                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&resp_6,
                                             "{  \"Groups\": {    \"Group\": [      {        \"GroupName\": \"GroupName\",        \"Comments\": \"Comments\",        \"JoinDate\": \"JoinDate\"      }    ]  }}"
                                             ,&local_2b9);
                                  HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                                  std::__cxx11::string::~string((string *)&resp_6);
                                  HttpTestListener::Start(this_00);
                                  std::__cxx11::string::assign((char *)&req);
                                  aliyun::Ram::ListGroupsForUser
                                            ((RamListGroupsForUserRequestType *)this,
                                             (RamListGroupsForUserResponseType *)&req,
                                             (RamErrorInfo *)&resp);
                                  HttpTestListener::WaitComplete(this_00);
                                }
                              }
                              else {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&resp_6,"127.0.0.1:12234",
                                           (allocator<char> *)&resp);
                                aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                                std::__cxx11::string::~string((string *)&resp_6);
                                if ((char)(this->new_user_name)._M_string_length == '\x01') {
                                  *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1)
                                       = 0;
                                }
                                this_00 = (HttpTestListener *)operator_new(0x180);
                                HttpTestListener::HttpTestListener(this_00,0x2fca);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&resp,
                                           "{  \"Groups\": {    \"Group\": [      {        \"GroupName\": \"GroupName\",        \"Comments\": \"Comments\",        \"CreateDate\": \"CreateDate\",        \"UpdateDate\": \"UpdateDate\"      }    ]  },  \"IsTruncated\": true,  \"Marker\": \"Marker\"}"
                                           ,&local_2b9);
                                HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                                std::__cxx11::string::~string((string *)&resp);
                                HttpTestListener::Start(this_00);
                                std::__cxx11::string::assign((char *)&req);
                                std::__cxx11::string::assign((char *)&local_138);
                                aliyun::Ram::ListGroups
                                          ((RamListGroupsRequestType *)this,
                                           (RamListGroupsResponseType *)&req,(RamErrorInfo *)&req_6)
                                ;
                                HttpTestListener::WaitComplete(this_00);
                              }
                            }
                            else {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&resp_6,"127.0.0.1:12234",
                                         (allocator<char> *)&resp);
                              aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                              std::__cxx11::string::~string((string *)&resp_6);
                              if ((char)(this->new_user_name)._M_string_length == '\x01') {
                                *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) =
                                     0;
                              }
                              this_00 = (HttpTestListener *)operator_new(0x180);
                              HttpTestListener::HttpTestListener(this_00,0x2fca);
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&resp,
                                         "{  \"Groups\": {    \"Group\": [      {        \"GroupName\": \"GroupName\",        \"Comments\": \"Comments\",        \"AttachDate\": \"AttachDate\"      }    ]  },  \"Users\": {    \"User\": [      {        \"UserId\": \"UserId\",        \"UserName\": \"UserName\",        \"DisplayName\": \"DisplayName\",        \"AttachDate\": \"AttachDate\"      }    ]  },  \"Roles\": {    \"Role\": [      {        \"RoleId\": \"RoleId\",        \"RoleName\": \"RoleName\",        \"Arn\": \"Arn\",        \"Description\": \"Description\",        \"AttachDate\": \"AttachDate\"      }    ]  }}"
                                         ,&local_2b9);
                              HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                              std::__cxx11::string::~string((string *)&resp);
                              HttpTestListener::Start(this_00);
                              std::__cxx11::string::assign((char *)&req_6);
                              std::__cxx11::string::assign((char *)&local_1f8);
                              aliyun::Ram::ListEntitiesForPolicy
                                        ((RamListEntitiesForPolicyRequestType *)this,
                                         (RamListEntitiesForPolicyResponseType *)&req_6,
                                         (RamErrorInfo *)&req);
                              HttpTestListener::WaitComplete(this_00);
                            }
                          }
                          else {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_258,"127.0.0.1:12234",
                                       (allocator<char> *)&resp_6);
                            aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                            std::__cxx11::string::~string((string *)&local_258);
                            if ((char)(this->new_user_name)._M_string_length == '\x01') {
                              *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0
                              ;
                            }
                            this_00 = (HttpTestListener *)operator_new(0x180);
                            HttpTestListener::HttpTestListener(this_00,0x2fca);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&resp_6,
                                       "{  \"AccessKeys\": {    \"AccessKey\": [      {        \"AccessKeyId\": \"AccessKeyId\",        \"Status\": \"Status\",        \"CreateDate\": \"CreateDate\"      }    ]  }}"
                                       ,&local_2b9);
                            HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                            std::__cxx11::string::~string((string *)&resp_6);
                            HttpTestListener::Start(this_00);
                            std::__cxx11::string::assign((char *)&req);
                            aliyun::Ram::ListAccessKeys
                                      ((RamListAccessKeysRequestType *)this,
                                       (RamListAccessKeysResponseType *)&req,(RamErrorInfo *)&resp);
                            HttpTestListener::WaitComplete(this_00);
                          }
                        }
                        else {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&resp_6,"127.0.0.1:12234",(allocator<char> *)&resp);
                          aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                          std::__cxx11::string::~string((string *)&resp_6);
                          if ((char)(this->new_user_name)._M_string_length == '\x01') {
                            *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                          }
                          this_00 = (HttpTestListener *)operator_new(0x180);
                          HttpTestListener::HttpTestListener(this_00,0x2fca);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&resp,
                                     "{  \"MFADevice\": {    \"SerialNumber\": \"SerialNumber\"  }}"
                                     ,&local_2b9);
                          HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                          std::__cxx11::string::~string((string *)&resp);
                          HttpTestListener::Start(this_00);
                          std::__cxx11::string::assign((char *)&req);
                          aliyun::Ram::GetUserMFAInfo
                                    ((RamGetUserMFAInfoRequestType *)this,
                                     (RamGetUserMFAInfoResponseType *)&req,(RamErrorInfo *)&req_6);
                          HttpTestListener::WaitComplete(this_00);
                        }
                      }
                      else {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&resp_6,"127.0.0.1:12234",(allocator<char> *)&resp);
                        aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
                        std::__cxx11::string::~string((string *)&resp_6);
                        if ((char)(this->new_user_name)._M_string_length == '\x01') {
                          *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                        }
                        this_00 = (HttpTestListener *)operator_new(0x180);
                        HttpTestListener::HttpTestListener(this_00,0x2fca);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&resp,
                                   "{  \"User\": {    \"UserId\": \"UserId\",    \"UserName\": \"UserName\",    \"DisplayName\": \"DisplayName\",    \"MobilePhone\": \"MobilePhone\",    \"Email\": \"Email\",    \"Comments\": \"Comments\",    \"CreateDate\": \"CreateDate\",    \"UpdateDate\": \"UpdateDate\",    \"LastLoginDate\": \"LastLoginDate\"  }}"
                                   ,&local_2b9);
                        HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                        std::__cxx11::string::~string((string *)&resp);
                        HttpTestListener::Start(this_00);
                        std::__cxx11::string::assign((char *)&req_6);
                        aliyun::Ram::GetUser
                                  ((RamGetUserRequestType *)this,(RamGetUserResponseType *)&req_6,
                                   (RamErrorInfo *)&req);
                        HttpTestListener::WaitComplete(this_00);
                      }
                      goto LAB_0010fc73;
                    }
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_278,"127.0.0.1:12234",(allocator<char> *)&local_258)
                    ;
                    aliyun::Ram::SetProxyHost((Ram *)this,&local_278);
                    std::__cxx11::string::~string((string *)&local_278);
                    if ((char)(this->new_user_name)._M_string_length == '\x01') {
                      *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                    }
                    this_00 = (HttpTestListener *)operator_new(0x180);
                    HttpTestListener::HttpTestListener(this_00,0x2fca);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_258,
                               "{  \"SecurityPreference\": {    \"LoginProfilePreference\": {      \"EnableSaveMFATicket\": true    }  }}"
                               ,(allocator<char> *)&resp);
                    HttpTestListener::SetResponseBody(this_00,&local_258);
                    std::__cxx11::string::~string((string *)&local_258);
                    HttpTestListener::Start(this_00);
                    aliyun::Ram::GetSecurityPreference
                              ((RamGetSecurityPreferenceResponseType *)this,(RamErrorInfo *)&resp_6)
                    ;
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_278,"127.0.0.1:12234",(allocator<char> *)&local_258)
                    ;
                    aliyun::Ram::SetProxyHost((Ram *)this,&local_278);
                    std::__cxx11::string::~string((string *)&local_278);
                    if ((char)(this->new_user_name)._M_string_length == '\x01') {
                      *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                    }
                    this_00 = (HttpTestListener *)operator_new(0x180);
                    HttpTestListener::HttpTestListener(this_00,0x2fca);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_258,
                               "{  \"PasswordPolicy\": {    \"MinimumPasswordLength\": 0,    \"RequireLowercaseCharacters\": true,    \"RequireUppercaseCharacters\": true,    \"RequireNumbers\": true,    \"RequireSymbols\": true  }}"
                               ,(allocator<char> *)&resp);
                    HttpTestListener::SetResponseBody(this_00,&local_258);
                    std::__cxx11::string::~string((string *)&local_258);
                    HttpTestListener::Start(this_00);
                    aliyun::Ram::GetPasswordPolicy
                              ((RamGetPasswordPolicyResponseType *)this,(RamErrorInfo *)&resp_6);
                  }
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
                  aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
                  std::__cxx11::string::~string((string *)&local_258);
                  if ((char)(this->new_user_name)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_6,
                             "{  \"SummaryMap\": {    \"UsersQuota\": 0,    \"Users\": 0,    \"AccessKeysPerUserQuota\": 0,    \"VirtualMFADevicesQuota\": 0,    \"MFADevices\": 0,    \"MFADevicesInUse\": 0,    \"GroupsQuota\": 0,    \"Groups\": 0,    \"GroupsPerUserQuota\": 0,    \"RolesQuota\": 0,    \"Roles\": 0,    \"PoliciesQuota\": 0,    \"Policies\": 0,    \"PolicySizeQuota\": 0,    \"VersionsPerPolicyQuota\": 0,    \"AttachedPoliciesPerUserQuota\": 0,    \"AttachedPoliciesPerGroupQuota\": 0,    \"AttachedPoliciesPerRoleQuota\": 0  }}"
                             ,(allocator<char> *)&resp);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
                  std::__cxx11::string::~string((string *)&resp_6);
                  HttpTestListener::Start(this_00);
                  aliyun::Ram::GetAccountSummary
                            ((RamGetAccountSummaryResponseType *)this,(RamErrorInfo *)&req);
                }
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"127.0.0.1:12234",(allocator<char> *)&local_258);
                aliyun::Ram::SetProxyHost((Ram *)this,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                if ((char)(this->new_user_name)._M_string_length == '\x01') {
                  *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
                }
                this_00 = (HttpTestListener *)operator_new(0x180);
                HttpTestListener::HttpTestListener(this_00,0x2fca);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,"{}",(allocator<char> *)&resp);
                HttpTestListener::SetResponseBody(this_00,&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                HttpTestListener::Start(this_00);
                aliyun::Ram::ClearAccountAlias
                          ((RamClearAccountAliasResponseType *)this,(RamErrorInfo *)&resp_6);
              }
              HttpTestListener::WaitComplete(this_00);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
              aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
              std::__cxx11::string::~string((string *)&local_258);
              if ((char)(this->new_user_name)._M_string_length == '\x01') {
                *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
              }
              this_00 = (HttpTestListener *)operator_new(0x180);
              HttpTestListener::HttpTestListener(this_00,0x2fca);
              std::__cxx11::string::string<std::allocator<char>>((string *)&resp_6,"{}",&local_2b9);
              HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
              std::__cxx11::string::~string((string *)&resp_6);
              HttpTestListener::Start(this_00);
              std::__cxx11::string::assign((char *)&req);
              std::__cxx11::string::assign((char *)&local_138);
              std::__cxx11::string::assign(local_118);
              std::__cxx11::string::assign(local_f8);
              aliyun::Ram::BindMFADevice
                        ((RamBindMFADeviceRequestType *)this,(RamBindMFADeviceResponseType *)&req,
                         (RamErrorInfo *)&resp);
              HttpTestListener::WaitComplete(this_00);
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
            aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
            std::__cxx11::string::~string((string *)&local_258);
            if ((char)(this->new_user_name)._M_string_length == '\x01') {
              *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
            }
            this_00 = (HttpTestListener *)operator_new(0x180);
            HttpTestListener::HttpTestListener(this_00,0x2fca);
            std::__cxx11::string::string<std::allocator<char>>((string *)&resp_6,"{}",&local_2b9);
            HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
            std::__cxx11::string::~string((string *)&resp_6);
            HttpTestListener::Start(this_00);
            std::__cxx11::string::assign((char *)&req);
            std::__cxx11::string::assign((char *)&local_138);
            std::__cxx11::string::assign(local_118);
            aliyun::Ram::AttachPolicyToUser
                      ((RamAttachPolicyToUserRequestType *)this,
                       (RamAttachPolicyToUserResponseType *)&req,(RamErrorInfo *)&resp);
            HttpTestListener::WaitComplete(this_00);
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
          aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
          std::__cxx11::string::~string((string *)&local_258);
          if ((char)(this->new_user_name)._M_string_length == '\x01') {
            *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
          }
          this_00 = (HttpTestListener *)operator_new(0x180);
          HttpTestListener::HttpTestListener(this_00,0x2fca);
          std::__cxx11::string::string<std::allocator<char>>((string *)&resp_6,"{}",&local_2b9);
          HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
          std::__cxx11::string::~string((string *)&resp_6);
          HttpTestListener::Start(this_00);
          std::__cxx11::string::assign((char *)&req);
          std::__cxx11::string::assign((char *)&local_138);
          std::__cxx11::string::assign(local_118);
          aliyun::Ram::AttachPolicyToRole
                    ((RamAttachPolicyToRoleRequestType *)this,
                     (RamAttachPolicyToRoleResponseType *)&req,(RamErrorInfo *)&resp);
          HttpTestListener::WaitComplete(this_00);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
        aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        if ((char)(this->new_user_name)._M_string_length == '\x01') {
          *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
        }
        this_00 = (HttpTestListener *)operator_new(0x180);
        HttpTestListener::HttpTestListener(this_00,0x2fca);
        std::__cxx11::string::string<std::allocator<char>>((string *)&resp_6,"{}",&local_2b9);
        HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
        std::__cxx11::string::~string((string *)&resp_6);
        HttpTestListener::Start(this_00);
        std::__cxx11::string::assign((char *)&req);
        std::__cxx11::string::assign((char *)&local_138);
        std::__cxx11::string::assign(local_118);
        aliyun::Ram::AttachPolicyToGroup
                  ((RamAttachPolicyToGroupRequestType *)this,
                   (RamAttachPolicyToGroupResponseType *)&req,(RamErrorInfo *)&resp);
        HttpTestListener::WaitComplete(this_00);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
      aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      if ((char)(this->new_user_name)._M_string_length == '\x01') {
        *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
      }
      this_00 = (HttpTestListener *)operator_new(0x180);
      HttpTestListener::HttpTestListener(this_00,0x2fca);
      std::__cxx11::string::string<std::allocator<char>>((string *)&resp_6,"{}",&local_2b9);
      HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
      std::__cxx11::string::~string((string *)&resp_6);
      HttpTestListener::Start(this_00);
      std::__cxx11::string::assign((char *)&req);
      std::__cxx11::string::assign((char *)&local_138);
      aliyun::Ram::AddUserToGroup
                ((RamAddUserToGroupRequestType *)this,(RamAddUserToGroupResponseType *)&req,
                 (RamErrorInfo *)&resp);
      HttpTestListener::WaitComplete(this_00);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"127.0.0.1:12234",(allocator<char> *)&resp_6);
    aliyun::Ram::SetProxyHost((Ram *)this,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    if ((char)(this->new_user_name)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
    }
    this_00 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(this_00,0x2fca);
    std::__cxx11::string::string<std::allocator<char>>((string *)&resp_6,"{}",&local_2b9);
    HttpTestListener::SetResponseBody(this_00,(string *)&resp_6);
    std::__cxx11::string::~string((string *)&resp_6);
    HttpTestListener::Start(this_00);
    std::__cxx11::string::assign((char *)&req);
    aliyun::Ram::ActivateService
              ((RamActivateServiceRequestType *)this,(RamActivateServiceResponseType *)&req,
               (RamErrorInfo *)&resp);
    HttpTestListener::WaitComplete(this_00);
  }
LAB_0010fc73:
  do {
    HttpTestListener::~HttpTestListener(this_00);
    operator_delete(this_00,0x180);
    aliyun::Ram::~Ram((Ram *)this);
    operator_delete(this,0x38);
LAB_0010fc9b:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resp_6,"127.0.0.1:12234",(allocator<char> *)&resp);
    aliyun::Ram::SetProxyHost((Ram *)this,(string *)&resp_6);
    std::__cxx11::string::~string((string *)&resp_6);
    if ((char)(this->new_user_name)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->new_user_name)._M_string_length + 1) = 0;
    }
    this_00 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(this_00,0x2fca);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resp,"{  \"Status\": \"Status\"}",&local_2b9);
    HttpTestListener::SetResponseBody(this_00,(string *)&resp);
    std::__cxx11::string::~string((string *)&resp);
    HttpTestListener::Start(this_00);
    std::__cxx11::string::assign((char *)&req);
    aliyun::Ram::GetServiceStatus
              ((RamGetServiceStatusRequestType *)this,(RamGetServiceStatusResponseType *)&req,
               (RamErrorInfo *)&req_6);
    HttpTestListener::WaitComplete(this_00);
  } while( true );
}

Assistant:

int main() {
  test_activate_service();
  test_add_user_to_group();
  test_attach_policy_to_group();
  test_attach_policy_to_role();
  test_attach_policy_to_user();
  test_bind_mf_adevice();
  test_clear_account_alias();
  test_create_access_key();
  test_create_group();
  test_create_login_profile();
  test_create_policy();
  test_create_policy_version();
  test_create_role();
  test_create_user();
  test_create_virtual_mf_adevice();
  test_deactivate_service();
  test_delete_access_key();
  test_delete_group();
  test_delete_login_profile();
  test_delete_policy();
  test_delete_policy_version();
  test_delete_role();
  test_delete_user();
  test_delete_virtual_mf_adevice();
  test_detach_policy_from_group();
  test_detach_policy_from_role();
  test_detach_policy_from_user();
  test_get_account_alias();
  test_get_account_summary();
  test_get_group();
  test_get_login_profile();
  test_get_password_policy();
  test_get_policy();
  test_get_policy_version();
  test_get_role();
  test_get_security_preference();
  test_get_service_status();
  test_get_user();
  test_get_user_mf_ainfo();
  test_list_access_keys();
  test_list_entities_for_policy();
  test_list_groups();
  test_list_groups_for_user();
  test_list_policies();
  test_list_policies_for_group();
  test_list_policies_for_role();
  test_list_policies_for_user();
  test_list_policy_versions();
  test_list_roles();
  test_list_users();
  test_list_users_for_group();
  test_list_virtual_mf_adevices();
  test_remove_user_from_group();
  test_set_account_alias();
  test_set_default_policy_version();
  test_set_password_policy();
  test_set_security_preference();
  test_unbind_mf_adevice();
  test_update_access_key();
  test_update_group();
  test_update_login_profile();
  test_update_role();
  test_update_user();
}